

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_AEAD_Chacha20Poly1305_Simd128.c
# Opt level: O0

void poly1305_padded_128(Lib_IntVector_Intrinsics_vec128 *ctx,uint32_t len,uint8_t *text)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  uint64_t uVar15;
  __uint64_t _Var16;
  __uint64_t _Var17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  Lib_IntVector_Intrinsics_vec128 o4_3;
  Lib_IntVector_Intrinsics_vec128 o3_3;
  Lib_IntVector_Intrinsics_vec128 o2_3;
  Lib_IntVector_Intrinsics_vec128 o1_3;
  Lib_IntVector_Intrinsics_vec128 o0_3;
  Lib_IntVector_Intrinsics_vec128 x42_3;
  Lib_IntVector_Intrinsics_vec128 x32_3;
  Lib_IntVector_Intrinsics_vec128 z03_3;
  Lib_IntVector_Intrinsics_vec128 x12_3;
  Lib_IntVector_Intrinsics_vec128 x31_3;
  Lib_IntVector_Intrinsics_vec128 x02_3;
  Lib_IntVector_Intrinsics_vec128 x21_3;
  Lib_IntVector_Intrinsics_vec128 z13_3;
  Lib_IntVector_Intrinsics_vec128 z02_3;
  Lib_IntVector_Intrinsics_vec128 x01_3;
  Lib_IntVector_Intrinsics_vec128 x2_3;
  Lib_IntVector_Intrinsics_vec128 x41_3;
  Lib_IntVector_Intrinsics_vec128 x11_3;
  Lib_IntVector_Intrinsics_vec128 z12_3;
  Lib_IntVector_Intrinsics_vec128 t_3;
  Lib_IntVector_Intrinsics_vec128 z11_3;
  Lib_IntVector_Intrinsics_vec128 z01_3;
  Lib_IntVector_Intrinsics_vec128 x4_3;
  Lib_IntVector_Intrinsics_vec128 x1_3;
  Lib_IntVector_Intrinsics_vec128 x3_3;
  Lib_IntVector_Intrinsics_vec128 x0_3;
  Lib_IntVector_Intrinsics_vec128 z1_3;
  Lib_IntVector_Intrinsics_vec128 z0_3;
  Lib_IntVector_Intrinsics_vec128 mask26_3;
  Lib_IntVector_Intrinsics_vec128 t4_3;
  Lib_IntVector_Intrinsics_vec128 t3_3;
  Lib_IntVector_Intrinsics_vec128 t2_3;
  Lib_IntVector_Intrinsics_vec128 t1_1;
  Lib_IntVector_Intrinsics_vec128 t0;
  Lib_IntVector_Intrinsics_vec128 a46_2;
  Lib_IntVector_Intrinsics_vec128 a36_2;
  Lib_IntVector_Intrinsics_vec128 a26_2;
  Lib_IntVector_Intrinsics_vec128 a16_2;
  Lib_IntVector_Intrinsics_vec128 a06_2;
  Lib_IntVector_Intrinsics_vec128 a45_2;
  Lib_IntVector_Intrinsics_vec128 a35_2;
  Lib_IntVector_Intrinsics_vec128 a25_2;
  Lib_IntVector_Intrinsics_vec128 a15_2;
  Lib_IntVector_Intrinsics_vec128 a05_2;
  Lib_IntVector_Intrinsics_vec128 a44_3;
  Lib_IntVector_Intrinsics_vec128 a34_3;
  Lib_IntVector_Intrinsics_vec128 a24_3;
  Lib_IntVector_Intrinsics_vec128 a14_3;
  Lib_IntVector_Intrinsics_vec128 a04_3;
  Lib_IntVector_Intrinsics_vec128 a43_3;
  Lib_IntVector_Intrinsics_vec128 a33_3;
  Lib_IntVector_Intrinsics_vec128 a23_3;
  Lib_IntVector_Intrinsics_vec128 a13_3;
  Lib_IntVector_Intrinsics_vec128 a03_3;
  Lib_IntVector_Intrinsics_vec128 a42_3;
  Lib_IntVector_Intrinsics_vec128 a32_3;
  Lib_IntVector_Intrinsics_vec128 a22_3;
  Lib_IntVector_Intrinsics_vec128 a12_3;
  Lib_IntVector_Intrinsics_vec128 a02_3;
  Lib_IntVector_Intrinsics_vec128 a41_3;
  Lib_IntVector_Intrinsics_vec128 a31_3;
  Lib_IntVector_Intrinsics_vec128 a21_3;
  Lib_IntVector_Intrinsics_vec128 a11_3;
  Lib_IntVector_Intrinsics_vec128 a01_3;
  Lib_IntVector_Intrinsics_vec128 a4_3;
  Lib_IntVector_Intrinsics_vec128 a3_3;
  Lib_IntVector_Intrinsics_vec128 a2_3;
  Lib_IntVector_Intrinsics_vec128 a1_3;
  Lib_IntVector_Intrinsics_vec128 a0_3;
  Lib_IntVector_Intrinsics_vec128 f14_3;
  Lib_IntVector_Intrinsics_vec128 f13_3;
  Lib_IntVector_Intrinsics_vec128 f12_3;
  Lib_IntVector_Intrinsics_vec128 f11_3;
  Lib_IntVector_Intrinsics_vec128 f10_3;
  Lib_IntVector_Intrinsics_vec128 r54_3;
  Lib_IntVector_Intrinsics_vec128 r53_3;
  Lib_IntVector_Intrinsics_vec128 r52_3;
  Lib_IntVector_Intrinsics_vec128 r51_3;
  Lib_IntVector_Intrinsics_vec128 r4_3;
  Lib_IntVector_Intrinsics_vec128 r3_3;
  Lib_IntVector_Intrinsics_vec128 r2_3;
  Lib_IntVector_Intrinsics_vec128 r11_2;
  Lib_IntVector_Intrinsics_vec128 r0_3;
  Lib_IntVector_Intrinsics_vec128 *r5_2;
  Lib_IntVector_Intrinsics_vec128 *r1_3;
  Lib_IntVector_Intrinsics_vec128 f4_3;
  Lib_IntVector_Intrinsics_vec128 mask_3;
  uint64_t b_3;
  Lib_IntVector_Intrinsics_vec128 f41_2;
  Lib_IntVector_Intrinsics_vec128 f3_3;
  Lib_IntVector_Intrinsics_vec128 f2_3;
  Lib_IntVector_Intrinsics_vec128 f111_2;
  Lib_IntVector_Intrinsics_vec128 f01_2;
  Lib_IntVector_Intrinsics_vec128 f40_3;
  Lib_IntVector_Intrinsics_vec128 f30_3;
  Lib_IntVector_Intrinsics_vec128 f20_3;
  Lib_IntVector_Intrinsics_vec128 f110_3;
  Lib_IntVector_Intrinsics_vec128 f010_2;
  Lib_IntVector_Intrinsics_vec128 f1_3;
  Lib_IntVector_Intrinsics_vec128 f0_3;
  uint64_t hi_3;
  uint64_t u_2;
  uint64_t lo_3;
  uint64_t u0_2;
  Lib_IntVector_Intrinsics_vec128 e_3 [5];
  Lib_IntVector_Intrinsics_vec128 *acc;
  Lib_IntVector_Intrinsics_vec128 *pre;
  uint8_t tmp [16];
  Lib_IntVector_Intrinsics_vec128 o4_2;
  Lib_IntVector_Intrinsics_vec128 o3_2;
  Lib_IntVector_Intrinsics_vec128 o2_2;
  Lib_IntVector_Intrinsics_vec128 o1_2;
  Lib_IntVector_Intrinsics_vec128 o0_2;
  Lib_IntVector_Intrinsics_vec128 x42_2;
  Lib_IntVector_Intrinsics_vec128 x32_2;
  Lib_IntVector_Intrinsics_vec128 z03_2;
  Lib_IntVector_Intrinsics_vec128 x12_2;
  Lib_IntVector_Intrinsics_vec128 x31_2;
  Lib_IntVector_Intrinsics_vec128 x02_2;
  Lib_IntVector_Intrinsics_vec128 x21_2;
  Lib_IntVector_Intrinsics_vec128 z13_2;
  Lib_IntVector_Intrinsics_vec128 z02_2;
  Lib_IntVector_Intrinsics_vec128 x01_2;
  Lib_IntVector_Intrinsics_vec128 x2_2;
  Lib_IntVector_Intrinsics_vec128 x41_2;
  Lib_IntVector_Intrinsics_vec128 x11_2;
  Lib_IntVector_Intrinsics_vec128 z12_2;
  Lib_IntVector_Intrinsics_vec128 t_2;
  Lib_IntVector_Intrinsics_vec128 z11_2;
  Lib_IntVector_Intrinsics_vec128 z01_2;
  Lib_IntVector_Intrinsics_vec128 x4_2;
  Lib_IntVector_Intrinsics_vec128 x1_2;
  Lib_IntVector_Intrinsics_vec128 x3_2;
  Lib_IntVector_Intrinsics_vec128 x0_2;
  Lib_IntVector_Intrinsics_vec128 z1_2;
  Lib_IntVector_Intrinsics_vec128 z0_2;
  Lib_IntVector_Intrinsics_vec128 mask26_2;
  Lib_IntVector_Intrinsics_vec128 t4_2;
  Lib_IntVector_Intrinsics_vec128 t3_2;
  Lib_IntVector_Intrinsics_vec128 t2_2;
  Lib_IntVector_Intrinsics_vec128 t11_1;
  Lib_IntVector_Intrinsics_vec128 t01_2;
  Lib_IntVector_Intrinsics_vec128 a46_1;
  Lib_IntVector_Intrinsics_vec128 a36_1;
  Lib_IntVector_Intrinsics_vec128 a26_1;
  Lib_IntVector_Intrinsics_vec128 a16_1;
  Lib_IntVector_Intrinsics_vec128 a06_1;
  Lib_IntVector_Intrinsics_vec128 a45_1;
  Lib_IntVector_Intrinsics_vec128 a35_1;
  Lib_IntVector_Intrinsics_vec128 a25_1;
  Lib_IntVector_Intrinsics_vec128 a15_1;
  Lib_IntVector_Intrinsics_vec128 a05_1;
  Lib_IntVector_Intrinsics_vec128 a44_2;
  Lib_IntVector_Intrinsics_vec128 a34_2;
  Lib_IntVector_Intrinsics_vec128 a24_2;
  Lib_IntVector_Intrinsics_vec128 a14_2;
  Lib_IntVector_Intrinsics_vec128 a04_2;
  Lib_IntVector_Intrinsics_vec128 a43_2;
  Lib_IntVector_Intrinsics_vec128 a33_2;
  Lib_IntVector_Intrinsics_vec128 a23_2;
  Lib_IntVector_Intrinsics_vec128 a13_2;
  Lib_IntVector_Intrinsics_vec128 a03_2;
  Lib_IntVector_Intrinsics_vec128 a42_2;
  Lib_IntVector_Intrinsics_vec128 a32_2;
  Lib_IntVector_Intrinsics_vec128 a22_2;
  Lib_IntVector_Intrinsics_vec128 a12_2;
  Lib_IntVector_Intrinsics_vec128 a02_2;
  Lib_IntVector_Intrinsics_vec128 a41_2;
  Lib_IntVector_Intrinsics_vec128 a31_2;
  Lib_IntVector_Intrinsics_vec128 a21_2;
  Lib_IntVector_Intrinsics_vec128 a11_2;
  Lib_IntVector_Intrinsics_vec128 a01_2;
  Lib_IntVector_Intrinsics_vec128 a4_2;
  Lib_IntVector_Intrinsics_vec128 a3_2;
  Lib_IntVector_Intrinsics_vec128 a2_2;
  Lib_IntVector_Intrinsics_vec128 a1_2;
  Lib_IntVector_Intrinsics_vec128 a0_2;
  Lib_IntVector_Intrinsics_vec128 f14_2;
  Lib_IntVector_Intrinsics_vec128 f13_2;
  Lib_IntVector_Intrinsics_vec128 f12_2;
  Lib_IntVector_Intrinsics_vec128 f11_2;
  Lib_IntVector_Intrinsics_vec128 f10_2;
  Lib_IntVector_Intrinsics_vec128 r54_2;
  Lib_IntVector_Intrinsics_vec128 r53_2;
  Lib_IntVector_Intrinsics_vec128 r52_2;
  Lib_IntVector_Intrinsics_vec128 r51_2;
  Lib_IntVector_Intrinsics_vec128 r4_2;
  Lib_IntVector_Intrinsics_vec128 r3_2;
  Lib_IntVector_Intrinsics_vec128 r2_2;
  Lib_IntVector_Intrinsics_vec128 r11_1;
  Lib_IntVector_Intrinsics_vec128 r0_2;
  Lib_IntVector_Intrinsics_vec128 *r5_1;
  Lib_IntVector_Intrinsics_vec128 *r1_2;
  Lib_IntVector_Intrinsics_vec128 fi;
  Lib_IntVector_Intrinsics_vec128 mask_2;
  uint64_t b_2;
  Lib_IntVector_Intrinsics_vec128 f4_2;
  Lib_IntVector_Intrinsics_vec128 f3_2;
  Lib_IntVector_Intrinsics_vec128 f2_2;
  Lib_IntVector_Intrinsics_vec128 f111_1;
  Lib_IntVector_Intrinsics_vec128 f01_1;
  Lib_IntVector_Intrinsics_vec128 f40_2;
  Lib_IntVector_Intrinsics_vec128 f30_2;
  Lib_IntVector_Intrinsics_vec128 f20_2;
  Lib_IntVector_Intrinsics_vec128 f110_2;
  Lib_IntVector_Intrinsics_vec128 f010_1;
  Lib_IntVector_Intrinsics_vec128 f1_2;
  Lib_IntVector_Intrinsics_vec128 f0_2;
  uint64_t hi_2;
  uint64_t u_1;
  uint64_t lo_2;
  uint64_t u0_1;
  uint8_t tmp_1 [16];
  Lib_IntVector_Intrinsics_vec128 e_2 [5];
  uint8_t *last;
  Lib_IntVector_Intrinsics_vec128 o4_1;
  Lib_IntVector_Intrinsics_vec128 o3_1;
  Lib_IntVector_Intrinsics_vec128 o2_1;
  Lib_IntVector_Intrinsics_vec128 o1_1;
  Lib_IntVector_Intrinsics_vec128 o0_1;
  Lib_IntVector_Intrinsics_vec128 x42_1;
  Lib_IntVector_Intrinsics_vec128 x32_1;
  Lib_IntVector_Intrinsics_vec128 z03_1;
  Lib_IntVector_Intrinsics_vec128 x12_1;
  Lib_IntVector_Intrinsics_vec128 x31_1;
  Lib_IntVector_Intrinsics_vec128 x02_1;
  Lib_IntVector_Intrinsics_vec128 x21_1;
  Lib_IntVector_Intrinsics_vec128 z13_1;
  Lib_IntVector_Intrinsics_vec128 z02_1;
  Lib_IntVector_Intrinsics_vec128 x01_1;
  Lib_IntVector_Intrinsics_vec128 x2_1;
  Lib_IntVector_Intrinsics_vec128 x41_1;
  Lib_IntVector_Intrinsics_vec128 x11_1;
  Lib_IntVector_Intrinsics_vec128 z12_1;
  Lib_IntVector_Intrinsics_vec128 t_1;
  Lib_IntVector_Intrinsics_vec128 z11_1;
  Lib_IntVector_Intrinsics_vec128 z01_1;
  Lib_IntVector_Intrinsics_vec128 x4_1;
  Lib_IntVector_Intrinsics_vec128 x1_1;
  Lib_IntVector_Intrinsics_vec128 x3_1;
  Lib_IntVector_Intrinsics_vec128 x0_1;
  Lib_IntVector_Intrinsics_vec128 z1_1;
  Lib_IntVector_Intrinsics_vec128 z0_1;
  Lib_IntVector_Intrinsics_vec128 mask26_1;
  Lib_IntVector_Intrinsics_vec128 t4_1;
  Lib_IntVector_Intrinsics_vec128 t3_1;
  Lib_IntVector_Intrinsics_vec128 t2_1;
  Lib_IntVector_Intrinsics_vec128 t11;
  Lib_IntVector_Intrinsics_vec128 t01_1;
  Lib_IntVector_Intrinsics_vec128 a46;
  Lib_IntVector_Intrinsics_vec128 a36;
  Lib_IntVector_Intrinsics_vec128 a26;
  Lib_IntVector_Intrinsics_vec128 a16;
  Lib_IntVector_Intrinsics_vec128 a06;
  Lib_IntVector_Intrinsics_vec128 a45;
  Lib_IntVector_Intrinsics_vec128 a35;
  Lib_IntVector_Intrinsics_vec128 a25;
  Lib_IntVector_Intrinsics_vec128 a15;
  Lib_IntVector_Intrinsics_vec128 a05;
  Lib_IntVector_Intrinsics_vec128 a44_1;
  Lib_IntVector_Intrinsics_vec128 a34_1;
  Lib_IntVector_Intrinsics_vec128 a24_1;
  Lib_IntVector_Intrinsics_vec128 a14_1;
  Lib_IntVector_Intrinsics_vec128 a04_1;
  Lib_IntVector_Intrinsics_vec128 a43_1;
  Lib_IntVector_Intrinsics_vec128 a33_1;
  Lib_IntVector_Intrinsics_vec128 a23_1;
  Lib_IntVector_Intrinsics_vec128 a13_1;
  Lib_IntVector_Intrinsics_vec128 a03_1;
  Lib_IntVector_Intrinsics_vec128 a42_1;
  Lib_IntVector_Intrinsics_vec128 a32_1;
  Lib_IntVector_Intrinsics_vec128 a22_1;
  Lib_IntVector_Intrinsics_vec128 a12_1;
  Lib_IntVector_Intrinsics_vec128 a02_1;
  Lib_IntVector_Intrinsics_vec128 a41_1;
  Lib_IntVector_Intrinsics_vec128 a31_1;
  Lib_IntVector_Intrinsics_vec128 a21_1;
  Lib_IntVector_Intrinsics_vec128 a11_1;
  Lib_IntVector_Intrinsics_vec128 a01_1;
  Lib_IntVector_Intrinsics_vec128 a4_1;
  Lib_IntVector_Intrinsics_vec128 a3_1;
  Lib_IntVector_Intrinsics_vec128 a2_1;
  Lib_IntVector_Intrinsics_vec128 a1_1;
  Lib_IntVector_Intrinsics_vec128 a0_1;
  Lib_IntVector_Intrinsics_vec128 f14_1;
  Lib_IntVector_Intrinsics_vec128 f13_1;
  Lib_IntVector_Intrinsics_vec128 f12_1;
  Lib_IntVector_Intrinsics_vec128 f11_1;
  Lib_IntVector_Intrinsics_vec128 f10_1;
  Lib_IntVector_Intrinsics_vec128 r54_1;
  Lib_IntVector_Intrinsics_vec128 r53_1;
  Lib_IntVector_Intrinsics_vec128 r52_1;
  Lib_IntVector_Intrinsics_vec128 r51_1;
  Lib_IntVector_Intrinsics_vec128 r4_1;
  Lib_IntVector_Intrinsics_vec128 r3_1;
  Lib_IntVector_Intrinsics_vec128 r2_1;
  Lib_IntVector_Intrinsics_vec128 r11;
  Lib_IntVector_Intrinsics_vec128 r0_1;
  Lib_IntVector_Intrinsics_vec128 *r5;
  Lib_IntVector_Intrinsics_vec128 *r1_1;
  Lib_IntVector_Intrinsics_vec128 f4_1;
  Lib_IntVector_Intrinsics_vec128 mask_1;
  uint64_t b_1;
  Lib_IntVector_Intrinsics_vec128 f41_1;
  Lib_IntVector_Intrinsics_vec128 f3_1;
  Lib_IntVector_Intrinsics_vec128 f2_1;
  Lib_IntVector_Intrinsics_vec128 f111;
  Lib_IntVector_Intrinsics_vec128 f01;
  Lib_IntVector_Intrinsics_vec128 f40_1;
  Lib_IntVector_Intrinsics_vec128 f30_1;
  Lib_IntVector_Intrinsics_vec128 f20_1;
  Lib_IntVector_Intrinsics_vec128 f110_1;
  Lib_IntVector_Intrinsics_vec128 f010;
  Lib_IntVector_Intrinsics_vec128 f1_1;
  Lib_IntVector_Intrinsics_vec128 f0_1;
  uint64_t hi_1;
  uint64_t u;
  uint64_t lo_1;
  uint64_t u0;
  Lib_IntVector_Intrinsics_vec128 e_1 [5];
  uint8_t *block_1;
  uint32_t i_1;
  uint32_t rem1;
  uint32_t nb;
  uint8_t *t10;
  uint32_t len1;
  Lib_IntVector_Intrinsics_vec128 o4;
  Lib_IntVector_Intrinsics_vec128 o3;
  Lib_IntVector_Intrinsics_vec128 o2;
  Lib_IntVector_Intrinsics_vec128 o1;
  Lib_IntVector_Intrinsics_vec128 o0;
  Lib_IntVector_Intrinsics_vec128 f24;
  Lib_IntVector_Intrinsics_vec128 f23;
  Lib_IntVector_Intrinsics_vec128 f22;
  Lib_IntVector_Intrinsics_vec128 f21;
  Lib_IntVector_Intrinsics_vec128 f20;
  Lib_IntVector_Intrinsics_vec128 f14;
  Lib_IntVector_Intrinsics_vec128 f13;
  Lib_IntVector_Intrinsics_vec128 f12;
  Lib_IntVector_Intrinsics_vec128 f11;
  Lib_IntVector_Intrinsics_vec128 f100;
  Lib_IntVector_Intrinsics_vec128 o40;
  Lib_IntVector_Intrinsics_vec128 o30;
  Lib_IntVector_Intrinsics_vec128 o20;
  Lib_IntVector_Intrinsics_vec128 o10;
  Lib_IntVector_Intrinsics_vec128 o00;
  Lib_IntVector_Intrinsics_vec128 x42;
  Lib_IntVector_Intrinsics_vec128 x32;
  Lib_IntVector_Intrinsics_vec128 z03;
  Lib_IntVector_Intrinsics_vec128 x12;
  Lib_IntVector_Intrinsics_vec128 x31;
  Lib_IntVector_Intrinsics_vec128 x02;
  Lib_IntVector_Intrinsics_vec128 x21;
  Lib_IntVector_Intrinsics_vec128 z13;
  Lib_IntVector_Intrinsics_vec128 z02;
  Lib_IntVector_Intrinsics_vec128 x01;
  Lib_IntVector_Intrinsics_vec128 x2;
  Lib_IntVector_Intrinsics_vec128 x41;
  Lib_IntVector_Intrinsics_vec128 x11;
  Lib_IntVector_Intrinsics_vec128 z12;
  Lib_IntVector_Intrinsics_vec128 t;
  Lib_IntVector_Intrinsics_vec128 z11;
  Lib_IntVector_Intrinsics_vec128 z01;
  Lib_IntVector_Intrinsics_vec128 x4;
  Lib_IntVector_Intrinsics_vec128 x1;
  Lib_IntVector_Intrinsics_vec128 x3;
  Lib_IntVector_Intrinsics_vec128 x0;
  Lib_IntVector_Intrinsics_vec128 z1;
  Lib_IntVector_Intrinsics_vec128 z0;
  Lib_IntVector_Intrinsics_vec128 mask26;
  Lib_IntVector_Intrinsics_vec128 t4;
  Lib_IntVector_Intrinsics_vec128 t3;
  Lib_IntVector_Intrinsics_vec128 t2;
  Lib_IntVector_Intrinsics_vec128 t1;
  Lib_IntVector_Intrinsics_vec128 t01;
  Lib_IntVector_Intrinsics_vec128 a44;
  Lib_IntVector_Intrinsics_vec128 a34;
  Lib_IntVector_Intrinsics_vec128 a24;
  Lib_IntVector_Intrinsics_vec128 a14;
  Lib_IntVector_Intrinsics_vec128 a04;
  Lib_IntVector_Intrinsics_vec128 a43;
  Lib_IntVector_Intrinsics_vec128 a33;
  Lib_IntVector_Intrinsics_vec128 a23;
  Lib_IntVector_Intrinsics_vec128 a13;
  Lib_IntVector_Intrinsics_vec128 a03;
  Lib_IntVector_Intrinsics_vec128 a42;
  Lib_IntVector_Intrinsics_vec128 a32;
  Lib_IntVector_Intrinsics_vec128 a22;
  Lib_IntVector_Intrinsics_vec128 a12;
  Lib_IntVector_Intrinsics_vec128 a02;
  Lib_IntVector_Intrinsics_vec128 a41;
  Lib_IntVector_Intrinsics_vec128 a31;
  Lib_IntVector_Intrinsics_vec128 a21;
  Lib_IntVector_Intrinsics_vec128 a11;
  Lib_IntVector_Intrinsics_vec128 a01;
  Lib_IntVector_Intrinsics_vec128 a4;
  Lib_IntVector_Intrinsics_vec128 a3;
  Lib_IntVector_Intrinsics_vec128 a2;
  Lib_IntVector_Intrinsics_vec128 a1;
  Lib_IntVector_Intrinsics_vec128 a0;
  Lib_IntVector_Intrinsics_vec128 f140;
  Lib_IntVector_Intrinsics_vec128 f130;
  Lib_IntVector_Intrinsics_vec128 f120;
  Lib_IntVector_Intrinsics_vec128 f110;
  Lib_IntVector_Intrinsics_vec128 f10;
  Lib_IntVector_Intrinsics_vec128 r54;
  Lib_IntVector_Intrinsics_vec128 r53;
  Lib_IntVector_Intrinsics_vec128 r52;
  Lib_IntVector_Intrinsics_vec128 r51;
  Lib_IntVector_Intrinsics_vec128 r4;
  Lib_IntVector_Intrinsics_vec128 r3;
  Lib_IntVector_Intrinsics_vec128 r2;
  Lib_IntVector_Intrinsics_vec128 r1;
  Lib_IntVector_Intrinsics_vec128 r0;
  Lib_IntVector_Intrinsics_vec128 *rn5;
  Lib_IntVector_Intrinsics_vec128 *rn;
  Lib_IntVector_Intrinsics_vec128 f4;
  Lib_IntVector_Intrinsics_vec128 mask;
  uint64_t b;
  Lib_IntVector_Intrinsics_vec128 f41;
  Lib_IntVector_Intrinsics_vec128 f3;
  Lib_IntVector_Intrinsics_vec128 f2;
  Lib_IntVector_Intrinsics_vec128 f1;
  Lib_IntVector_Intrinsics_vec128 f0;
  Lib_IntVector_Intrinsics_vec128 f40;
  Lib_IntVector_Intrinsics_vec128 f30;
  Lib_IntVector_Intrinsics_vec128 f25;
  Lib_IntVector_Intrinsics_vec128 f15;
  Lib_IntVector_Intrinsics_vec128 f00;
  Lib_IntVector_Intrinsics_vec128 hi;
  Lib_IntVector_Intrinsics_vec128 lo;
  Lib_IntVector_Intrinsics_vec128 b2;
  Lib_IntVector_Intrinsics_vec128 b1;
  Lib_IntVector_Intrinsics_vec128 e [5];
  uint8_t *block;
  uint32_t i;
  uint32_t nb_1;
  uint8_t *text1;
  uint32_t len1_1;
  uint8_t *text0;
  uint32_t bs;
  uint8_t *t00;
  uint32_t len0;
  uint32_t sz_block;
  Lib_IntVector_Intrinsics_vec128 *acc0;
  Lib_IntVector_Intrinsics_vec128 *pre0;
  uint8_t *rem;
  uint8_t *blocks;
  uint32_t r;
  uint32_t n;
  uint8_t *text_local;
  uint32_t len_local;
  Lib_IntVector_Intrinsics_vec128 *ctx_local;
  uint uStack_3e0;
  uint uStack_3d0;
  
  uVar13 = len >> 4;
  uVar14 = (uVar13 << 4) / 0x20;
  if (uVar14 != 0) {
    Hacl_MAC_Poly1305_Simd128_load_acc2(ctx,text);
    for (block._0_4_ = 0; (uint)block < (uVar14 * 0x20 - 0x20) / 0x20; block._0_4_ = (uint)block + 1
        ) {
      uVar22 = (ulong)((uint)block * 0x20);
      uVar34 = *(ulong *)(text + uVar22 + 0x30);
      b1[0]._4_4_ = (uint)((ulong)*(undefined8 *)(text + uVar22 + 0x28) >> 0x20);
      b2[0]._4_4_ = (uint)((ulong)*(undefined8 *)(text + uVar22 + 0x38) >> 0x20);
      hi[1] = CONCAT44(b2[0]._4_4_,uStack_3e0);
      uVar22 = ctx[0xf][0];
      uVar23 = ctx[0xf][1];
      uVar24 = ctx[0x10][0];
      uVar39 = ctx[0x10][1];
      uVar40 = ctx[0x11][0];
      uVar41 = ctx[0x11][1];
      uVar1 = ctx[0x17][0];
      uVar2 = ctx[0x17][1];
      uVar3 = ctx[0x18][0];
      uVar25 = ctx[0x18][1];
      uVar26 = (*ctx)[0];
      uVar27 = (*ctx)[1];
      uVar28 = ctx[1][0];
      uVar29 = ctx[1][1];
      uVar30 = ctx[2][0];
      uVar31 = ctx[2][1];
      uVar32 = ctx[3][0];
      uVar33 = ctx[3][1];
      uVar42 = ctx[4][0];
      uVar43 = ctx[4][1];
      uVar18 = (uVar22 & 0xffffffff) * (uVar26 & 0xffffffff) +
               (uVar3 & 0xffffffff) * (uVar28 & 0xffffffff) +
               (uVar1 & 0xffffffff) * (uVar30 & 0xffffffff) +
               (ctx[0x16][0] & 0xffffffffU) * (uVar32 & 0xffffffff) +
               (ctx[0x15][0] & 0xffffffffU) * (uVar42 & 0xffffffff);
      uVar35 = (uVar23 & 0xffffffff) * (uVar27 & 0xffffffff) +
               (uVar25 & 0xffffffff) * (uVar29 & 0xffffffff) +
               (uVar2 & 0xffffffff) * (uVar31 & 0xffffffff) +
               (ctx[0x16][1] & 0xffffffffU) * (uVar33 & 0xffffffff) +
               (ctx[0x15][1] & 0xffffffffU) * (uVar43 & 0xffffffff);
      uVar19 = (ctx[0x12][0] & 0xffffffffU) * (uVar26 & 0xffffffff) +
               (uVar40 & 0xffffffff) * (uVar28 & 0xffffffff) +
               (uVar24 & 0xffffffff) * (uVar30 & 0xffffffff) +
               (uVar22 & 0xffffffff) * (uVar32 & 0xffffffff) +
               (uVar3 & 0xffffffff) * (uVar42 & 0xffffffff);
      uVar36 = (ctx[0x12][1] & 0xffffffffU) * (uVar27 & 0xffffffff) +
               (uVar41 & 0xffffffff) * (uVar29 & 0xffffffff) +
               (uVar39 & 0xffffffff) * (uVar31 & 0xffffffff) +
               (uVar23 & 0xffffffff) * (uVar33 & 0xffffffff) +
               (uVar25 & 0xffffffff) * (uVar43 & 0xffffffff);
      uVar20 = (uVar24 & 0xffffffff) * (uVar26 & 0xffffffff) +
               (uVar22 & 0xffffffff) * (uVar28 & 0xffffffff) +
               (uVar3 & 0xffffffff) * (uVar30 & 0xffffffff) +
               (uVar1 & 0xffffffff) * (uVar32 & 0xffffffff) +
               (ctx[0x16][0] & 0xffffffffU) * (uVar42 & 0xffffffff) + (uVar18 >> 0x1a);
      uVar37 = (uVar39 & 0xffffffff) * (uVar27 & 0xffffffff) +
               (uVar23 & 0xffffffff) * (uVar29 & 0xffffffff) +
               (uVar25 & 0xffffffff) * (uVar31 & 0xffffffff) +
               (uVar2 & 0xffffffff) * (uVar33 & 0xffffffff) +
               (ctx[0x16][1] & 0xffffffffU) * (uVar43 & 0xffffffff) + (uVar35 >> 0x1a);
      uVar21 = (ctx[0x13][0] & 0xffffffffU) * (uVar26 & 0xffffffff) +
               (ctx[0x12][0] & 0xffffffffU) * (uVar28 & 0xffffffff) +
               (uVar40 & 0xffffffff) * (uVar30 & 0xffffffff) +
               (uVar24 & 0xffffffff) * (uVar32 & 0xffffffff) +
               (uVar22 & 0xffffffff) * (uVar42 & 0xffffffff) + (uVar19 >> 0x1a);
      uVar38 = (ctx[0x13][1] & 0xffffffffU) * (uVar27 & 0xffffffff) +
               (ctx[0x12][1] & 0xffffffffU) * (uVar29 & 0xffffffff) +
               (uVar41 & 0xffffffff) * (uVar31 & 0xffffffff) +
               (uVar39 & 0xffffffff) * (uVar33 & 0xffffffff) +
               (uVar23 & 0xffffffff) * (uVar43 & 0xffffffff) + (uVar36 >> 0x1a);
      uVar22 = (uVar40 & 0xffffffff) * (uVar26 & 0xffffffff) +
               (uVar24 & 0xffffffff) * (uVar28 & 0xffffffff) +
               (uVar22 & 0xffffffff) * (uVar30 & 0xffffffff) +
               (uVar3 & 0xffffffff) * (uVar32 & 0xffffffff) +
               (uVar1 & 0xffffffff) * (uVar42 & 0xffffffff) + (uVar20 >> 0x1a);
      uVar39 = (uVar41 & 0xffffffff) * (uVar27 & 0xffffffff) +
               (uVar39 & 0xffffffff) * (uVar29 & 0xffffffff) +
               (uVar23 & 0xffffffff) * (uVar31 & 0xffffffff) +
               (uVar25 & 0xffffffff) * (uVar33 & 0xffffffff) +
               (uVar2 & 0xffffffff) * (uVar43 & 0xffffffff) + (uVar37 >> 0x1a);
      uVar23 = (uVar18 & 0x3ffffff) + (uVar21 >> 0x1a) * 5;
      uVar40 = (uVar35 & 0x3ffffff) + (uVar38 >> 0x1a) * 2;
      uVar24 = (uVar19 & 0x3ffffff) + (uVar22 >> 0x1a);
      uVar41 = (uVar36 & 0x3ffffff) + (uVar39 >> 0x1a);
      (*ctx)[0] = uVar23 & 0x3ffffff;
      (*ctx)[1] = uVar40 & 0x3ffffff;
      ctx[1][0] = (uVar20 & 0x3ffffff) + (uVar23 >> 0x1a);
      ctx[1][1] = (uVar37 & 0x3ffffff) + (uVar40 >> 0x1a);
      ctx[2][0] = uVar22 & 0x3ffffff;
      ctx[2][1] = uVar39 & 0x3ffffff;
      ctx[3][0] = uVar24 & 0x3ffffff;
      ctx[3][1] = uVar41 & 0x3ffffff;
      ctx[4][0] = (uVar21 & 0x3ffffff) + (uVar24 >> 0x1a);
      ctx[4][1] = (uVar38 & 0x3ffffff) + (uVar41 >> 0x1a);
      lVar4 = (*ctx)[1];
      lVar5 = ctx[1][0];
      lVar6 = ctx[1][1];
      lVar7 = ctx[2][0];
      lVar8 = ctx[2][1];
      lVar9 = ctx[3][0];
      lVar10 = ctx[3][1];
      lVar11 = ctx[4][0];
      lVar12 = ctx[4][1];
      (*ctx)[0] = (*ctx)[0] + ((ulong)uStack_3e0 & 0x3ffffff);
      (*ctx)[1] = lVar4 + (uVar34 & 0x3ffffff);
      ctx[1][0] = lVar5 + ((ulong)hi[1] >> 0x1a & 0x3ffffff);
      ctx[1][1] = lVar6 + (uVar34 >> 0x1a & 0x3ffffff);
      ctx[2][0] = lVar7 + ((ulong)(b2[0]._4_4_ >> 0x14) | (f00[1] & 0x3fffU) << 0xc);
      ctx[2][1] = lVar8 + (uVar34 >> 0x34 | (ulong)uStack_3d0 & 0x3fff);
      ctx[3][0] = lVar9 + ((ulong)f00[1] >> 0xe & 0x3ffffff);
      ctx[3][1] = lVar10 + (CONCAT44(b1[0]._4_4_,uStack_3d0) >> 0xe & 0x3ffffff);
      ctx[4][0] = lVar11 + ((ulong)f00[1] >> 0x28 | 0x1000000);
      ctx[4][1] = lVar12 + ((ulong)(b1[0]._4_4_ >> 8) | 0x1000000);
    }
    Hacl_MAC_Poly1305_Simd128_fmul_r2_normalize(ctx,ctx + 5);
  }
  for (block_1._4_4_ = 0; block_1._4_4_ < uVar13 * 0x10 + uVar14 * -0x20 >> 4;
      block_1._4_4_ = block_1._4_4_ + 1) {
    uVar15 = load64(text + (ulong)(block_1._4_4_ << 4) + (ulong)(uVar14 * 0x20));
    _Var16 = __uint64_identity(uVar15);
    uVar15 = load64(text + (ulong)(block_1._4_4_ << 4) + (ulong)(uVar14 * 0x20) + 8);
    _Var17 = __uint64_identity(uVar15);
    uVar34 = ctx[5][0];
    uVar22 = ctx[5][1];
    uVar23 = ctx[6][0];
    uVar24 = ctx[6][1];
    uVar39 = ctx[7][0];
    uVar40 = ctx[7][1];
    uVar41 = ctx[0xd][0];
    uVar1 = ctx[0xd][1];
    uVar2 = ctx[0xe][0];
    uVar3 = ctx[0xe][1];
    uVar25 = (*ctx)[0] + (_Var16 & 0x3ffffff);
    uVar42 = (*ctx)[1] + (_Var16 & 0x3ffffff);
    uVar26 = ctx[1][0] + (_Var16 >> 0x1a & 0x3ffffff);
    uVar43 = ctx[1][1] + (_Var16 >> 0x1a & 0x3ffffff);
    uVar27 = ctx[2][0] + (_Var16 >> 0x34 | (_Var17 & 0x3fff) << 0xc);
    uVar18 = ctx[2][1] + (_Var16 >> 0x34 | _Var17 & 0x3fff);
    uVar28 = ctx[3][0] + (_Var17 >> 0xe & 0x3ffffff);
    uVar19 = ctx[3][1] + (_Var17 >> 0xe & 0x3ffffff);
    uVar29 = ctx[4][0] + (_Var17 >> 0x28 | 0x1000000);
    uVar20 = ctx[4][1] + (_Var17 >> 0x28 | 0x1000000);
    uVar30 = (uVar34 & 0xffffffff) * (uVar25 & 0xffffffff) +
             (uVar2 & 0xffffffff) * (uVar26 & 0xffffffff) +
             (uVar41 & 0xffffffff) * (uVar27 & 0xffffffff) +
             (ctx[0xc][0] & 0xffffffffU) * (uVar28 & 0xffffffff) +
             (ctx[0xb][0] & 0xffffffffU) * (uVar29 & 0xffffffff);
    uVar21 = (uVar22 & 0xffffffff) * (uVar42 & 0xffffffff) +
             (uVar3 & 0xffffffff) * (uVar43 & 0xffffffff) +
             (uVar1 & 0xffffffff) * (uVar18 & 0xffffffff) +
             (ctx[0xc][1] & 0xffffffffU) * (uVar19 & 0xffffffff) +
             (ctx[0xb][1] & 0xffffffffU) * (uVar20 & 0xffffffff);
    uVar31 = (ctx[8][0] & 0xffffffffU) * (uVar25 & 0xffffffff) +
             (uVar39 & 0xffffffff) * (uVar26 & 0xffffffff) +
             (uVar23 & 0xffffffff) * (uVar27 & 0xffffffff) +
             (uVar34 & 0xffffffff) * (uVar28 & 0xffffffff) +
             (uVar2 & 0xffffffff) * (uVar29 & 0xffffffff);
    uVar35 = (ctx[8][1] & 0xffffffffU) * (uVar42 & 0xffffffff) +
             (uVar40 & 0xffffffff) * (uVar43 & 0xffffffff) +
             (uVar24 & 0xffffffff) * (uVar18 & 0xffffffff) +
             (uVar22 & 0xffffffff) * (uVar19 & 0xffffffff) +
             (uVar3 & 0xffffffff) * (uVar20 & 0xffffffff);
    uVar32 = (uVar23 & 0xffffffff) * (uVar25 & 0xffffffff) +
             (uVar34 & 0xffffffff) * (uVar26 & 0xffffffff) +
             (uVar2 & 0xffffffff) * (uVar27 & 0xffffffff) +
             (uVar41 & 0xffffffff) * (uVar28 & 0xffffffff) +
             (ctx[0xc][0] & 0xffffffffU) * (uVar29 & 0xffffffff) + (uVar30 >> 0x1a);
    uVar36 = (uVar24 & 0xffffffff) * (uVar42 & 0xffffffff) +
             (uVar22 & 0xffffffff) * (uVar43 & 0xffffffff) +
             (uVar3 & 0xffffffff) * (uVar18 & 0xffffffff) +
             (uVar1 & 0xffffffff) * (uVar19 & 0xffffffff) +
             (ctx[0xc][1] & 0xffffffffU) * (uVar20 & 0xffffffff) + (uVar21 >> 0x1a);
    uVar33 = (ctx[9][0] & 0xffffffffU) * (uVar25 & 0xffffffff) +
             (ctx[8][0] & 0xffffffffU) * (uVar26 & 0xffffffff) +
             (uVar39 & 0xffffffff) * (uVar27 & 0xffffffff) +
             (uVar23 & 0xffffffff) * (uVar28 & 0xffffffff) +
             (uVar34 & 0xffffffff) * (uVar29 & 0xffffffff) + (uVar31 >> 0x1a);
    uVar37 = (ctx[9][1] & 0xffffffffU) * (uVar42 & 0xffffffff) +
             (ctx[8][1] & 0xffffffffU) * (uVar43 & 0xffffffff) +
             (uVar40 & 0xffffffff) * (uVar18 & 0xffffffff) +
             (uVar24 & 0xffffffff) * (uVar19 & 0xffffffff) +
             (uVar22 & 0xffffffff) * (uVar20 & 0xffffffff) + (uVar35 >> 0x1a);
    uVar34 = (uVar39 & 0xffffffff) * (uVar25 & 0xffffffff) +
             (uVar23 & 0xffffffff) * (uVar26 & 0xffffffff) +
             (uVar34 & 0xffffffff) * (uVar27 & 0xffffffff) +
             (uVar2 & 0xffffffff) * (uVar28 & 0xffffffff) +
             (uVar41 & 0xffffffff) * (uVar29 & 0xffffffff) + (uVar32 >> 0x1a);
    uVar24 = (uVar40 & 0xffffffff) * (uVar42 & 0xffffffff) +
             (uVar24 & 0xffffffff) * (uVar43 & 0xffffffff) +
             (uVar22 & 0xffffffff) * (uVar18 & 0xffffffff) +
             (uVar3 & 0xffffffff) * (uVar19 & 0xffffffff) +
             (uVar1 & 0xffffffff) * (uVar20 & 0xffffffff) + (uVar36 >> 0x1a);
    uVar22 = (uVar30 & 0x3ffffff) + (uVar33 >> 0x1a) * 5;
    uVar39 = (uVar21 & 0x3ffffff) + (uVar37 >> 0x1a) * 2;
    uVar23 = (uVar31 & 0x3ffffff) + (uVar34 >> 0x1a);
    uVar40 = (uVar35 & 0x3ffffff) + (uVar24 >> 0x1a);
    (*ctx)[0] = uVar22 & 0x3ffffff;
    (*ctx)[1] = uVar39 & 0x3ffffff;
    ctx[1][0] = (uVar32 & 0x3ffffff) + (uVar22 >> 0x1a);
    ctx[1][1] = (uVar36 & 0x3ffffff) + (uVar39 >> 0x1a);
    ctx[2][0] = uVar34 & 0x3ffffff;
    ctx[2][1] = uVar24 & 0x3ffffff;
    ctx[3][0] = uVar23 & 0x3ffffff;
    ctx[3][1] = uVar40 & 0x3ffffff;
    ctx[4][0] = (uVar33 & 0x3ffffff) + (uVar23 >> 0x1a);
    ctx[4][1] = (uVar37 & 0x3ffffff) + (uVar40 >> 0x1a);
  }
  memset(&pre,0,0x10);
  memcpy(&pre,text + (uVar13 << 4),(ulong)(len & 0xf));
  if ((len & 0xf) != 0) {
    uVar15 = load64((uint8_t *)&pre);
    _Var16 = __uint64_identity(uVar15);
    uVar15 = load64(tmp);
    _Var17 = __uint64_identity(uVar15);
    uVar34 = ctx[5][0];
    uVar22 = ctx[5][1];
    uVar23 = ctx[6][0];
    uVar24 = ctx[6][1];
    uVar39 = ctx[7][0];
    uVar40 = ctx[7][1];
    uVar41 = ctx[0xd][0];
    uVar1 = ctx[0xd][1];
    uVar2 = ctx[0xe][0];
    uVar3 = ctx[0xe][1];
    uVar25 = (*ctx)[0] + (_Var16 & 0x3ffffff);
    uVar42 = (*ctx)[1] + (_Var16 & 0x3ffffff);
    uVar26 = ctx[1][0] + (_Var16 >> 0x1a & 0x3ffffff);
    uVar43 = ctx[1][1] + (_Var16 >> 0x1a & 0x3ffffff);
    uVar27 = ctx[2][0] + (_Var16 >> 0x34 | (_Var17 & 0x3fff) << 0xc);
    uVar18 = ctx[2][1] + (_Var16 >> 0x34 | _Var17 & 0x3fff);
    uVar28 = ctx[3][0] + (_Var17 >> 0xe & 0x3ffffff);
    uVar19 = ctx[3][1] + (_Var17 >> 0xe & 0x3ffffff);
    uVar29 = ctx[4][0] + (_Var17 >> 0x28 | 0x1000000);
    uVar20 = ctx[4][1] + (_Var17 >> 0x28 | 0x1000000);
    uVar30 = (uVar34 & 0xffffffff) * (uVar25 & 0xffffffff) +
             (uVar2 & 0xffffffff) * (uVar26 & 0xffffffff) +
             (uVar41 & 0xffffffff) * (uVar27 & 0xffffffff) +
             (ctx[0xc][0] & 0xffffffffU) * (uVar28 & 0xffffffff) +
             (ctx[0xb][0] & 0xffffffffU) * (uVar29 & 0xffffffff);
    uVar21 = (uVar22 & 0xffffffff) * (uVar42 & 0xffffffff) +
             (uVar3 & 0xffffffff) * (uVar43 & 0xffffffff) +
             (uVar1 & 0xffffffff) * (uVar18 & 0xffffffff) +
             (ctx[0xc][1] & 0xffffffffU) * (uVar19 & 0xffffffff) +
             (ctx[0xb][1] & 0xffffffffU) * (uVar20 & 0xffffffff);
    uVar31 = (ctx[8][0] & 0xffffffffU) * (uVar25 & 0xffffffff) +
             (uVar39 & 0xffffffff) * (uVar26 & 0xffffffff) +
             (uVar23 & 0xffffffff) * (uVar27 & 0xffffffff) +
             (uVar34 & 0xffffffff) * (uVar28 & 0xffffffff) +
             (uVar2 & 0xffffffff) * (uVar29 & 0xffffffff);
    uVar35 = (ctx[8][1] & 0xffffffffU) * (uVar42 & 0xffffffff) +
             (uVar40 & 0xffffffff) * (uVar43 & 0xffffffff) +
             (uVar24 & 0xffffffff) * (uVar18 & 0xffffffff) +
             (uVar22 & 0xffffffff) * (uVar19 & 0xffffffff) +
             (uVar3 & 0xffffffff) * (uVar20 & 0xffffffff);
    uVar32 = (uVar23 & 0xffffffff) * (uVar25 & 0xffffffff) +
             (uVar34 & 0xffffffff) * (uVar26 & 0xffffffff) +
             (uVar2 & 0xffffffff) * (uVar27 & 0xffffffff) +
             (uVar41 & 0xffffffff) * (uVar28 & 0xffffffff) +
             (ctx[0xc][0] & 0xffffffffU) * (uVar29 & 0xffffffff) + (uVar30 >> 0x1a);
    uVar36 = (uVar24 & 0xffffffff) * (uVar42 & 0xffffffff) +
             (uVar22 & 0xffffffff) * (uVar43 & 0xffffffff) +
             (uVar3 & 0xffffffff) * (uVar18 & 0xffffffff) +
             (uVar1 & 0xffffffff) * (uVar19 & 0xffffffff) +
             (ctx[0xc][1] & 0xffffffffU) * (uVar20 & 0xffffffff) + (uVar21 >> 0x1a);
    uVar33 = (ctx[9][0] & 0xffffffffU) * (uVar25 & 0xffffffff) +
             (ctx[8][0] & 0xffffffffU) * (uVar26 & 0xffffffff) +
             (uVar39 & 0xffffffff) * (uVar27 & 0xffffffff) +
             (uVar23 & 0xffffffff) * (uVar28 & 0xffffffff) +
             (uVar34 & 0xffffffff) * (uVar29 & 0xffffffff) + (uVar31 >> 0x1a);
    uVar37 = (ctx[9][1] & 0xffffffffU) * (uVar42 & 0xffffffff) +
             (ctx[8][1] & 0xffffffffU) * (uVar43 & 0xffffffff) +
             (uVar40 & 0xffffffff) * (uVar18 & 0xffffffff) +
             (uVar24 & 0xffffffff) * (uVar19 & 0xffffffff) +
             (uVar22 & 0xffffffff) * (uVar20 & 0xffffffff) + (uVar35 >> 0x1a);
    uVar34 = (uVar39 & 0xffffffff) * (uVar25 & 0xffffffff) +
             (uVar23 & 0xffffffff) * (uVar26 & 0xffffffff) +
             (uVar34 & 0xffffffff) * (uVar27 & 0xffffffff) +
             (uVar2 & 0xffffffff) * (uVar28 & 0xffffffff) +
             (uVar41 & 0xffffffff) * (uVar29 & 0xffffffff) + (uVar32 >> 0x1a);
    uVar24 = (uVar40 & 0xffffffff) * (uVar42 & 0xffffffff) +
             (uVar24 & 0xffffffff) * (uVar43 & 0xffffffff) +
             (uVar22 & 0xffffffff) * (uVar18 & 0xffffffff) +
             (uVar3 & 0xffffffff) * (uVar19 & 0xffffffff) +
             (uVar1 & 0xffffffff) * (uVar20 & 0xffffffff) + (uVar36 >> 0x1a);
    uVar22 = (uVar30 & 0x3ffffff) + (uVar33 >> 0x1a) * 5;
    uVar39 = (uVar21 & 0x3ffffff) + (uVar37 >> 0x1a) * 2;
    uVar23 = (uVar31 & 0x3ffffff) + (uVar34 >> 0x1a);
    uVar40 = (uVar35 & 0x3ffffff) + (uVar24 >> 0x1a);
    (*ctx)[0] = uVar22 & 0x3ffffff;
    (*ctx)[1] = uVar39 & 0x3ffffff;
    ctx[1][0] = (uVar32 & 0x3ffffff) + (uVar22 >> 0x1a);
    ctx[1][1] = (uVar36 & 0x3ffffff) + (uVar39 >> 0x1a);
    ctx[2][0] = uVar34 & 0x3ffffff;
    ctx[2][1] = uVar24 & 0x3ffffff;
    ctx[3][0] = uVar23 & 0x3ffffff;
    ctx[3][1] = uVar40 & 0x3ffffff;
    ctx[4][0] = (uVar33 & 0x3ffffff) + (uVar23 >> 0x1a);
    ctx[4][1] = (uVar37 & 0x3ffffff) + (uVar40 >> 0x1a);
  }
  return;
}

Assistant:

static inline void
poly1305_padded_128(Lib_IntVector_Intrinsics_vec128 *ctx, uint32_t len, uint8_t *text)
{
  uint32_t n = len / 16U;
  uint32_t r = len % 16U;
  uint8_t *blocks = text;
  uint8_t *rem = text + n * 16U;
  Lib_IntVector_Intrinsics_vec128 *pre0 = ctx + 5U;
  Lib_IntVector_Intrinsics_vec128 *acc0 = ctx;
  uint32_t sz_block = 32U;
  uint32_t len0 = n * 16U / sz_block * sz_block;
  uint8_t *t00 = blocks;
  if (len0 > 0U)
  {
    uint32_t bs = 32U;
    uint8_t *text0 = t00;
    Hacl_MAC_Poly1305_Simd128_load_acc2(acc0, text0);
    uint32_t len1 = len0 - bs;
    uint8_t *text1 = t00 + bs;
    uint32_t nb = len1 / bs;
    for (uint32_t i = 0U; i < nb; i++)
    {
      uint8_t *block = text1 + i * bs;
      KRML_PRE_ALIGN(16) Lib_IntVector_Intrinsics_vec128 e[5U] KRML_POST_ALIGN(16) = { 0U };
      Lib_IntVector_Intrinsics_vec128 b1 = Lib_IntVector_Intrinsics_vec128_load64_le(block);
      Lib_IntVector_Intrinsics_vec128 b2 = Lib_IntVector_Intrinsics_vec128_load64_le(block + 16U);
      Lib_IntVector_Intrinsics_vec128 lo = Lib_IntVector_Intrinsics_vec128_interleave_low64(b1, b2);
      Lib_IntVector_Intrinsics_vec128
      hi = Lib_IntVector_Intrinsics_vec128_interleave_high64(b1, b2);
      Lib_IntVector_Intrinsics_vec128
      f00 =
        Lib_IntVector_Intrinsics_vec128_and(lo,
          Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
      Lib_IntVector_Intrinsics_vec128
      f15 =
        Lib_IntVector_Intrinsics_vec128_and(Lib_IntVector_Intrinsics_vec128_shift_right64(lo, 26U),
          Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
      Lib_IntVector_Intrinsics_vec128
      f25 =
        Lib_IntVector_Intrinsics_vec128_or(Lib_IntVector_Intrinsics_vec128_shift_right64(lo, 52U),
          Lib_IntVector_Intrinsics_vec128_shift_left64(Lib_IntVector_Intrinsics_vec128_and(hi,
              Lib_IntVector_Intrinsics_vec128_load64(0x3fffULL)),
            12U));
      Lib_IntVector_Intrinsics_vec128
      f30 =
        Lib_IntVector_Intrinsics_vec128_and(Lib_IntVector_Intrinsics_vec128_shift_right64(hi, 14U),
          Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
      Lib_IntVector_Intrinsics_vec128 f40 = Lib_IntVector_Intrinsics_vec128_shift_right64(hi, 40U);
      Lib_IntVector_Intrinsics_vec128 f0 = f00;
      Lib_IntVector_Intrinsics_vec128 f1 = f15;
      Lib_IntVector_Intrinsics_vec128 f2 = f25;
      Lib_IntVector_Intrinsics_vec128 f3 = f30;
      Lib_IntVector_Intrinsics_vec128 f41 = f40;
      e[0U] = f0;
      e[1U] = f1;
      e[2U] = f2;
      e[3U] = f3;
      e[4U] = f41;
      uint64_t b = 0x1000000ULL;
      Lib_IntVector_Intrinsics_vec128 mask = Lib_IntVector_Intrinsics_vec128_load64(b);
      Lib_IntVector_Intrinsics_vec128 f4 = e[4U];
      e[4U] = Lib_IntVector_Intrinsics_vec128_or(f4, mask);
      Lib_IntVector_Intrinsics_vec128 *rn = pre0 + 10U;
      Lib_IntVector_Intrinsics_vec128 *rn5 = pre0 + 15U;
      Lib_IntVector_Intrinsics_vec128 r0 = rn[0U];
      Lib_IntVector_Intrinsics_vec128 r1 = rn[1U];
      Lib_IntVector_Intrinsics_vec128 r2 = rn[2U];
      Lib_IntVector_Intrinsics_vec128 r3 = rn[3U];
      Lib_IntVector_Intrinsics_vec128 r4 = rn[4U];
      Lib_IntVector_Intrinsics_vec128 r51 = rn5[1U];
      Lib_IntVector_Intrinsics_vec128 r52 = rn5[2U];
      Lib_IntVector_Intrinsics_vec128 r53 = rn5[3U];
      Lib_IntVector_Intrinsics_vec128 r54 = rn5[4U];
      Lib_IntVector_Intrinsics_vec128 f10 = acc0[0U];
      Lib_IntVector_Intrinsics_vec128 f110 = acc0[1U];
      Lib_IntVector_Intrinsics_vec128 f120 = acc0[2U];
      Lib_IntVector_Intrinsics_vec128 f130 = acc0[3U];
      Lib_IntVector_Intrinsics_vec128 f140 = acc0[4U];
      Lib_IntVector_Intrinsics_vec128 a0 = Lib_IntVector_Intrinsics_vec128_mul64(r0, f10);
      Lib_IntVector_Intrinsics_vec128 a1 = Lib_IntVector_Intrinsics_vec128_mul64(r1, f10);
      Lib_IntVector_Intrinsics_vec128 a2 = Lib_IntVector_Intrinsics_vec128_mul64(r2, f10);
      Lib_IntVector_Intrinsics_vec128 a3 = Lib_IntVector_Intrinsics_vec128_mul64(r3, f10);
      Lib_IntVector_Intrinsics_vec128 a4 = Lib_IntVector_Intrinsics_vec128_mul64(r4, f10);
      Lib_IntVector_Intrinsics_vec128
      a01 =
        Lib_IntVector_Intrinsics_vec128_add64(a0,
          Lib_IntVector_Intrinsics_vec128_mul64(r54, f110));
      Lib_IntVector_Intrinsics_vec128
      a11 =
        Lib_IntVector_Intrinsics_vec128_add64(a1,
          Lib_IntVector_Intrinsics_vec128_mul64(r0, f110));
      Lib_IntVector_Intrinsics_vec128
      a21 =
        Lib_IntVector_Intrinsics_vec128_add64(a2,
          Lib_IntVector_Intrinsics_vec128_mul64(r1, f110));
      Lib_IntVector_Intrinsics_vec128
      a31 =
        Lib_IntVector_Intrinsics_vec128_add64(a3,
          Lib_IntVector_Intrinsics_vec128_mul64(r2, f110));
      Lib_IntVector_Intrinsics_vec128
      a41 =
        Lib_IntVector_Intrinsics_vec128_add64(a4,
          Lib_IntVector_Intrinsics_vec128_mul64(r3, f110));
      Lib_IntVector_Intrinsics_vec128
      a02 =
        Lib_IntVector_Intrinsics_vec128_add64(a01,
          Lib_IntVector_Intrinsics_vec128_mul64(r53, f120));
      Lib_IntVector_Intrinsics_vec128
      a12 =
        Lib_IntVector_Intrinsics_vec128_add64(a11,
          Lib_IntVector_Intrinsics_vec128_mul64(r54, f120));
      Lib_IntVector_Intrinsics_vec128
      a22 =
        Lib_IntVector_Intrinsics_vec128_add64(a21,
          Lib_IntVector_Intrinsics_vec128_mul64(r0, f120));
      Lib_IntVector_Intrinsics_vec128
      a32 =
        Lib_IntVector_Intrinsics_vec128_add64(a31,
          Lib_IntVector_Intrinsics_vec128_mul64(r1, f120));
      Lib_IntVector_Intrinsics_vec128
      a42 =
        Lib_IntVector_Intrinsics_vec128_add64(a41,
          Lib_IntVector_Intrinsics_vec128_mul64(r2, f120));
      Lib_IntVector_Intrinsics_vec128
      a03 =
        Lib_IntVector_Intrinsics_vec128_add64(a02,
          Lib_IntVector_Intrinsics_vec128_mul64(r52, f130));
      Lib_IntVector_Intrinsics_vec128
      a13 =
        Lib_IntVector_Intrinsics_vec128_add64(a12,
          Lib_IntVector_Intrinsics_vec128_mul64(r53, f130));
      Lib_IntVector_Intrinsics_vec128
      a23 =
        Lib_IntVector_Intrinsics_vec128_add64(a22,
          Lib_IntVector_Intrinsics_vec128_mul64(r54, f130));
      Lib_IntVector_Intrinsics_vec128
      a33 =
        Lib_IntVector_Intrinsics_vec128_add64(a32,
          Lib_IntVector_Intrinsics_vec128_mul64(r0, f130));
      Lib_IntVector_Intrinsics_vec128
      a43 =
        Lib_IntVector_Intrinsics_vec128_add64(a42,
          Lib_IntVector_Intrinsics_vec128_mul64(r1, f130));
      Lib_IntVector_Intrinsics_vec128
      a04 =
        Lib_IntVector_Intrinsics_vec128_add64(a03,
          Lib_IntVector_Intrinsics_vec128_mul64(r51, f140));
      Lib_IntVector_Intrinsics_vec128
      a14 =
        Lib_IntVector_Intrinsics_vec128_add64(a13,
          Lib_IntVector_Intrinsics_vec128_mul64(r52, f140));
      Lib_IntVector_Intrinsics_vec128
      a24 =
        Lib_IntVector_Intrinsics_vec128_add64(a23,
          Lib_IntVector_Intrinsics_vec128_mul64(r53, f140));
      Lib_IntVector_Intrinsics_vec128
      a34 =
        Lib_IntVector_Intrinsics_vec128_add64(a33,
          Lib_IntVector_Intrinsics_vec128_mul64(r54, f140));
      Lib_IntVector_Intrinsics_vec128
      a44 =
        Lib_IntVector_Intrinsics_vec128_add64(a43,
          Lib_IntVector_Intrinsics_vec128_mul64(r0, f140));
      Lib_IntVector_Intrinsics_vec128 t01 = a04;
      Lib_IntVector_Intrinsics_vec128 t1 = a14;
      Lib_IntVector_Intrinsics_vec128 t2 = a24;
      Lib_IntVector_Intrinsics_vec128 t3 = a34;
      Lib_IntVector_Intrinsics_vec128 t4 = a44;
      Lib_IntVector_Intrinsics_vec128 mask26 = Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL);
      Lib_IntVector_Intrinsics_vec128 z0 = Lib_IntVector_Intrinsics_vec128_shift_right64(t01, 26U);
      Lib_IntVector_Intrinsics_vec128 z1 = Lib_IntVector_Intrinsics_vec128_shift_right64(t3, 26U);
      Lib_IntVector_Intrinsics_vec128 x0 = Lib_IntVector_Intrinsics_vec128_and(t01, mask26);
      Lib_IntVector_Intrinsics_vec128 x3 = Lib_IntVector_Intrinsics_vec128_and(t3, mask26);
      Lib_IntVector_Intrinsics_vec128 x1 = Lib_IntVector_Intrinsics_vec128_add64(t1, z0);
      Lib_IntVector_Intrinsics_vec128 x4 = Lib_IntVector_Intrinsics_vec128_add64(t4, z1);
      Lib_IntVector_Intrinsics_vec128 z01 = Lib_IntVector_Intrinsics_vec128_shift_right64(x1, 26U);
      Lib_IntVector_Intrinsics_vec128 z11 = Lib_IntVector_Intrinsics_vec128_shift_right64(x4, 26U);
      Lib_IntVector_Intrinsics_vec128 t = Lib_IntVector_Intrinsics_vec128_shift_left64(z11, 2U);
      Lib_IntVector_Intrinsics_vec128 z12 = Lib_IntVector_Intrinsics_vec128_add64(z11, t);
      Lib_IntVector_Intrinsics_vec128 x11 = Lib_IntVector_Intrinsics_vec128_and(x1, mask26);
      Lib_IntVector_Intrinsics_vec128 x41 = Lib_IntVector_Intrinsics_vec128_and(x4, mask26);
      Lib_IntVector_Intrinsics_vec128 x2 = Lib_IntVector_Intrinsics_vec128_add64(t2, z01);
      Lib_IntVector_Intrinsics_vec128 x01 = Lib_IntVector_Intrinsics_vec128_add64(x0, z12);
      Lib_IntVector_Intrinsics_vec128 z02 = Lib_IntVector_Intrinsics_vec128_shift_right64(x2, 26U);
      Lib_IntVector_Intrinsics_vec128 z13 = Lib_IntVector_Intrinsics_vec128_shift_right64(x01, 26U);
      Lib_IntVector_Intrinsics_vec128 x21 = Lib_IntVector_Intrinsics_vec128_and(x2, mask26);
      Lib_IntVector_Intrinsics_vec128 x02 = Lib_IntVector_Intrinsics_vec128_and(x01, mask26);
      Lib_IntVector_Intrinsics_vec128 x31 = Lib_IntVector_Intrinsics_vec128_add64(x3, z02);
      Lib_IntVector_Intrinsics_vec128 x12 = Lib_IntVector_Intrinsics_vec128_add64(x11, z13);
      Lib_IntVector_Intrinsics_vec128 z03 = Lib_IntVector_Intrinsics_vec128_shift_right64(x31, 26U);
      Lib_IntVector_Intrinsics_vec128 x32 = Lib_IntVector_Intrinsics_vec128_and(x31, mask26);
      Lib_IntVector_Intrinsics_vec128 x42 = Lib_IntVector_Intrinsics_vec128_add64(x41, z03);
      Lib_IntVector_Intrinsics_vec128 o00 = x02;
      Lib_IntVector_Intrinsics_vec128 o10 = x12;
      Lib_IntVector_Intrinsics_vec128 o20 = x21;
      Lib_IntVector_Intrinsics_vec128 o30 = x32;
      Lib_IntVector_Intrinsics_vec128 o40 = x42;
      acc0[0U] = o00;
      acc0[1U] = o10;
      acc0[2U] = o20;
      acc0[3U] = o30;
      acc0[4U] = o40;
      Lib_IntVector_Intrinsics_vec128 f100 = acc0[0U];
      Lib_IntVector_Intrinsics_vec128 f11 = acc0[1U];
      Lib_IntVector_Intrinsics_vec128 f12 = acc0[2U];
      Lib_IntVector_Intrinsics_vec128 f13 = acc0[3U];
      Lib_IntVector_Intrinsics_vec128 f14 = acc0[4U];
      Lib_IntVector_Intrinsics_vec128 f20 = e[0U];
      Lib_IntVector_Intrinsics_vec128 f21 = e[1U];
      Lib_IntVector_Intrinsics_vec128 f22 = e[2U];
      Lib_IntVector_Intrinsics_vec128 f23 = e[3U];
      Lib_IntVector_Intrinsics_vec128 f24 = e[4U];
      Lib_IntVector_Intrinsics_vec128 o0 = Lib_IntVector_Intrinsics_vec128_add64(f100, f20);
      Lib_IntVector_Intrinsics_vec128 o1 = Lib_IntVector_Intrinsics_vec128_add64(f11, f21);
      Lib_IntVector_Intrinsics_vec128 o2 = Lib_IntVector_Intrinsics_vec128_add64(f12, f22);
      Lib_IntVector_Intrinsics_vec128 o3 = Lib_IntVector_Intrinsics_vec128_add64(f13, f23);
      Lib_IntVector_Intrinsics_vec128 o4 = Lib_IntVector_Intrinsics_vec128_add64(f14, f24);
      acc0[0U] = o0;
      acc0[1U] = o1;
      acc0[2U] = o2;
      acc0[3U] = o3;
      acc0[4U] = o4;
    }
    Hacl_MAC_Poly1305_Simd128_fmul_r2_normalize(acc0, pre0);
  }
  uint32_t len1 = n * 16U - len0;
  uint8_t *t10 = blocks + len0;
  uint32_t nb = len1 / 16U;
  uint32_t rem1 = len1 % 16U;
  for (uint32_t i = 0U; i < nb; i++)
  {
    uint8_t *block = t10 + i * 16U;
    KRML_PRE_ALIGN(16) Lib_IntVector_Intrinsics_vec128 e[5U] KRML_POST_ALIGN(16) = { 0U };
    uint64_t u0 = load64_le(block);
    uint64_t lo = u0;
    uint64_t u = load64_le(block + 8U);
    uint64_t hi = u;
    Lib_IntVector_Intrinsics_vec128 f0 = Lib_IntVector_Intrinsics_vec128_load64(lo);
    Lib_IntVector_Intrinsics_vec128 f1 = Lib_IntVector_Intrinsics_vec128_load64(hi);
    Lib_IntVector_Intrinsics_vec128
    f010 =
      Lib_IntVector_Intrinsics_vec128_and(f0,
        Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
    Lib_IntVector_Intrinsics_vec128
    f110 =
      Lib_IntVector_Intrinsics_vec128_and(Lib_IntVector_Intrinsics_vec128_shift_right64(f0, 26U),
        Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
    Lib_IntVector_Intrinsics_vec128
    f20 =
      Lib_IntVector_Intrinsics_vec128_or(Lib_IntVector_Intrinsics_vec128_shift_right64(f0, 52U),
        Lib_IntVector_Intrinsics_vec128_shift_left64(Lib_IntVector_Intrinsics_vec128_and(f1,
            Lib_IntVector_Intrinsics_vec128_load64(0x3fffULL)),
          12U));
    Lib_IntVector_Intrinsics_vec128
    f30 =
      Lib_IntVector_Intrinsics_vec128_and(Lib_IntVector_Intrinsics_vec128_shift_right64(f1, 14U),
        Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
    Lib_IntVector_Intrinsics_vec128 f40 = Lib_IntVector_Intrinsics_vec128_shift_right64(f1, 40U);
    Lib_IntVector_Intrinsics_vec128 f01 = f010;
    Lib_IntVector_Intrinsics_vec128 f111 = f110;
    Lib_IntVector_Intrinsics_vec128 f2 = f20;
    Lib_IntVector_Intrinsics_vec128 f3 = f30;
    Lib_IntVector_Intrinsics_vec128 f41 = f40;
    e[0U] = f01;
    e[1U] = f111;
    e[2U] = f2;
    e[3U] = f3;
    e[4U] = f41;
    uint64_t b = 0x1000000ULL;
    Lib_IntVector_Intrinsics_vec128 mask = Lib_IntVector_Intrinsics_vec128_load64(b);
    Lib_IntVector_Intrinsics_vec128 f4 = e[4U];
    e[4U] = Lib_IntVector_Intrinsics_vec128_or(f4, mask);
    Lib_IntVector_Intrinsics_vec128 *r1 = pre0;
    Lib_IntVector_Intrinsics_vec128 *r5 = pre0 + 5U;
    Lib_IntVector_Intrinsics_vec128 r0 = r1[0U];
    Lib_IntVector_Intrinsics_vec128 r11 = r1[1U];
    Lib_IntVector_Intrinsics_vec128 r2 = r1[2U];
    Lib_IntVector_Intrinsics_vec128 r3 = r1[3U];
    Lib_IntVector_Intrinsics_vec128 r4 = r1[4U];
    Lib_IntVector_Intrinsics_vec128 r51 = r5[1U];
    Lib_IntVector_Intrinsics_vec128 r52 = r5[2U];
    Lib_IntVector_Intrinsics_vec128 r53 = r5[3U];
    Lib_IntVector_Intrinsics_vec128 r54 = r5[4U];
    Lib_IntVector_Intrinsics_vec128 f10 = e[0U];
    Lib_IntVector_Intrinsics_vec128 f11 = e[1U];
    Lib_IntVector_Intrinsics_vec128 f12 = e[2U];
    Lib_IntVector_Intrinsics_vec128 f13 = e[3U];
    Lib_IntVector_Intrinsics_vec128 f14 = e[4U];
    Lib_IntVector_Intrinsics_vec128 a0 = acc0[0U];
    Lib_IntVector_Intrinsics_vec128 a1 = acc0[1U];
    Lib_IntVector_Intrinsics_vec128 a2 = acc0[2U];
    Lib_IntVector_Intrinsics_vec128 a3 = acc0[3U];
    Lib_IntVector_Intrinsics_vec128 a4 = acc0[4U];
    Lib_IntVector_Intrinsics_vec128 a01 = Lib_IntVector_Intrinsics_vec128_add64(a0, f10);
    Lib_IntVector_Intrinsics_vec128 a11 = Lib_IntVector_Intrinsics_vec128_add64(a1, f11);
    Lib_IntVector_Intrinsics_vec128 a21 = Lib_IntVector_Intrinsics_vec128_add64(a2, f12);
    Lib_IntVector_Intrinsics_vec128 a31 = Lib_IntVector_Intrinsics_vec128_add64(a3, f13);
    Lib_IntVector_Intrinsics_vec128 a41 = Lib_IntVector_Intrinsics_vec128_add64(a4, f14);
    Lib_IntVector_Intrinsics_vec128 a02 = Lib_IntVector_Intrinsics_vec128_mul64(r0, a01);
    Lib_IntVector_Intrinsics_vec128 a12 = Lib_IntVector_Intrinsics_vec128_mul64(r11, a01);
    Lib_IntVector_Intrinsics_vec128 a22 = Lib_IntVector_Intrinsics_vec128_mul64(r2, a01);
    Lib_IntVector_Intrinsics_vec128 a32 = Lib_IntVector_Intrinsics_vec128_mul64(r3, a01);
    Lib_IntVector_Intrinsics_vec128 a42 = Lib_IntVector_Intrinsics_vec128_mul64(r4, a01);
    Lib_IntVector_Intrinsics_vec128
    a03 =
      Lib_IntVector_Intrinsics_vec128_add64(a02,
        Lib_IntVector_Intrinsics_vec128_mul64(r54, a11));
    Lib_IntVector_Intrinsics_vec128
    a13 =
      Lib_IntVector_Intrinsics_vec128_add64(a12,
        Lib_IntVector_Intrinsics_vec128_mul64(r0, a11));
    Lib_IntVector_Intrinsics_vec128
    a23 =
      Lib_IntVector_Intrinsics_vec128_add64(a22,
        Lib_IntVector_Intrinsics_vec128_mul64(r11, a11));
    Lib_IntVector_Intrinsics_vec128
    a33 =
      Lib_IntVector_Intrinsics_vec128_add64(a32,
        Lib_IntVector_Intrinsics_vec128_mul64(r2, a11));
    Lib_IntVector_Intrinsics_vec128
    a43 =
      Lib_IntVector_Intrinsics_vec128_add64(a42,
        Lib_IntVector_Intrinsics_vec128_mul64(r3, a11));
    Lib_IntVector_Intrinsics_vec128
    a04 =
      Lib_IntVector_Intrinsics_vec128_add64(a03,
        Lib_IntVector_Intrinsics_vec128_mul64(r53, a21));
    Lib_IntVector_Intrinsics_vec128
    a14 =
      Lib_IntVector_Intrinsics_vec128_add64(a13,
        Lib_IntVector_Intrinsics_vec128_mul64(r54, a21));
    Lib_IntVector_Intrinsics_vec128
    a24 =
      Lib_IntVector_Intrinsics_vec128_add64(a23,
        Lib_IntVector_Intrinsics_vec128_mul64(r0, a21));
    Lib_IntVector_Intrinsics_vec128
    a34 =
      Lib_IntVector_Intrinsics_vec128_add64(a33,
        Lib_IntVector_Intrinsics_vec128_mul64(r11, a21));
    Lib_IntVector_Intrinsics_vec128
    a44 =
      Lib_IntVector_Intrinsics_vec128_add64(a43,
        Lib_IntVector_Intrinsics_vec128_mul64(r2, a21));
    Lib_IntVector_Intrinsics_vec128
    a05 =
      Lib_IntVector_Intrinsics_vec128_add64(a04,
        Lib_IntVector_Intrinsics_vec128_mul64(r52, a31));
    Lib_IntVector_Intrinsics_vec128
    a15 =
      Lib_IntVector_Intrinsics_vec128_add64(a14,
        Lib_IntVector_Intrinsics_vec128_mul64(r53, a31));
    Lib_IntVector_Intrinsics_vec128
    a25 =
      Lib_IntVector_Intrinsics_vec128_add64(a24,
        Lib_IntVector_Intrinsics_vec128_mul64(r54, a31));
    Lib_IntVector_Intrinsics_vec128
    a35 =
      Lib_IntVector_Intrinsics_vec128_add64(a34,
        Lib_IntVector_Intrinsics_vec128_mul64(r0, a31));
    Lib_IntVector_Intrinsics_vec128
    a45 =
      Lib_IntVector_Intrinsics_vec128_add64(a44,
        Lib_IntVector_Intrinsics_vec128_mul64(r11, a31));
    Lib_IntVector_Intrinsics_vec128
    a06 =
      Lib_IntVector_Intrinsics_vec128_add64(a05,
        Lib_IntVector_Intrinsics_vec128_mul64(r51, a41));
    Lib_IntVector_Intrinsics_vec128
    a16 =
      Lib_IntVector_Intrinsics_vec128_add64(a15,
        Lib_IntVector_Intrinsics_vec128_mul64(r52, a41));
    Lib_IntVector_Intrinsics_vec128
    a26 =
      Lib_IntVector_Intrinsics_vec128_add64(a25,
        Lib_IntVector_Intrinsics_vec128_mul64(r53, a41));
    Lib_IntVector_Intrinsics_vec128
    a36 =
      Lib_IntVector_Intrinsics_vec128_add64(a35,
        Lib_IntVector_Intrinsics_vec128_mul64(r54, a41));
    Lib_IntVector_Intrinsics_vec128
    a46 =
      Lib_IntVector_Intrinsics_vec128_add64(a45,
        Lib_IntVector_Intrinsics_vec128_mul64(r0, a41));
    Lib_IntVector_Intrinsics_vec128 t01 = a06;
    Lib_IntVector_Intrinsics_vec128 t11 = a16;
    Lib_IntVector_Intrinsics_vec128 t2 = a26;
    Lib_IntVector_Intrinsics_vec128 t3 = a36;
    Lib_IntVector_Intrinsics_vec128 t4 = a46;
    Lib_IntVector_Intrinsics_vec128 mask26 = Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL);
    Lib_IntVector_Intrinsics_vec128 z0 = Lib_IntVector_Intrinsics_vec128_shift_right64(t01, 26U);
    Lib_IntVector_Intrinsics_vec128 z1 = Lib_IntVector_Intrinsics_vec128_shift_right64(t3, 26U);
    Lib_IntVector_Intrinsics_vec128 x0 = Lib_IntVector_Intrinsics_vec128_and(t01, mask26);
    Lib_IntVector_Intrinsics_vec128 x3 = Lib_IntVector_Intrinsics_vec128_and(t3, mask26);
    Lib_IntVector_Intrinsics_vec128 x1 = Lib_IntVector_Intrinsics_vec128_add64(t11, z0);
    Lib_IntVector_Intrinsics_vec128 x4 = Lib_IntVector_Intrinsics_vec128_add64(t4, z1);
    Lib_IntVector_Intrinsics_vec128 z01 = Lib_IntVector_Intrinsics_vec128_shift_right64(x1, 26U);
    Lib_IntVector_Intrinsics_vec128 z11 = Lib_IntVector_Intrinsics_vec128_shift_right64(x4, 26U);
    Lib_IntVector_Intrinsics_vec128 t = Lib_IntVector_Intrinsics_vec128_shift_left64(z11, 2U);
    Lib_IntVector_Intrinsics_vec128 z12 = Lib_IntVector_Intrinsics_vec128_add64(z11, t);
    Lib_IntVector_Intrinsics_vec128 x11 = Lib_IntVector_Intrinsics_vec128_and(x1, mask26);
    Lib_IntVector_Intrinsics_vec128 x41 = Lib_IntVector_Intrinsics_vec128_and(x4, mask26);
    Lib_IntVector_Intrinsics_vec128 x2 = Lib_IntVector_Intrinsics_vec128_add64(t2, z01);
    Lib_IntVector_Intrinsics_vec128 x01 = Lib_IntVector_Intrinsics_vec128_add64(x0, z12);
    Lib_IntVector_Intrinsics_vec128 z02 = Lib_IntVector_Intrinsics_vec128_shift_right64(x2, 26U);
    Lib_IntVector_Intrinsics_vec128 z13 = Lib_IntVector_Intrinsics_vec128_shift_right64(x01, 26U);
    Lib_IntVector_Intrinsics_vec128 x21 = Lib_IntVector_Intrinsics_vec128_and(x2, mask26);
    Lib_IntVector_Intrinsics_vec128 x02 = Lib_IntVector_Intrinsics_vec128_and(x01, mask26);
    Lib_IntVector_Intrinsics_vec128 x31 = Lib_IntVector_Intrinsics_vec128_add64(x3, z02);
    Lib_IntVector_Intrinsics_vec128 x12 = Lib_IntVector_Intrinsics_vec128_add64(x11, z13);
    Lib_IntVector_Intrinsics_vec128 z03 = Lib_IntVector_Intrinsics_vec128_shift_right64(x31, 26U);
    Lib_IntVector_Intrinsics_vec128 x32 = Lib_IntVector_Intrinsics_vec128_and(x31, mask26);
    Lib_IntVector_Intrinsics_vec128 x42 = Lib_IntVector_Intrinsics_vec128_add64(x41, z03);
    Lib_IntVector_Intrinsics_vec128 o0 = x02;
    Lib_IntVector_Intrinsics_vec128 o1 = x12;
    Lib_IntVector_Intrinsics_vec128 o2 = x21;
    Lib_IntVector_Intrinsics_vec128 o3 = x32;
    Lib_IntVector_Intrinsics_vec128 o4 = x42;
    acc0[0U] = o0;
    acc0[1U] = o1;
    acc0[2U] = o2;
    acc0[3U] = o3;
    acc0[4U] = o4;
  }
  if (rem1 > 0U)
  {
    uint8_t *last = t10 + nb * 16U;
    KRML_PRE_ALIGN(16) Lib_IntVector_Intrinsics_vec128 e[5U] KRML_POST_ALIGN(16) = { 0U };
    uint8_t tmp[16U] = { 0U };
    memcpy(tmp, last, rem1 * sizeof (uint8_t));
    uint64_t u0 = load64_le(tmp);
    uint64_t lo = u0;
    uint64_t u = load64_le(tmp + 8U);
    uint64_t hi = u;
    Lib_IntVector_Intrinsics_vec128 f0 = Lib_IntVector_Intrinsics_vec128_load64(lo);
    Lib_IntVector_Intrinsics_vec128 f1 = Lib_IntVector_Intrinsics_vec128_load64(hi);
    Lib_IntVector_Intrinsics_vec128
    f010 =
      Lib_IntVector_Intrinsics_vec128_and(f0,
        Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
    Lib_IntVector_Intrinsics_vec128
    f110 =
      Lib_IntVector_Intrinsics_vec128_and(Lib_IntVector_Intrinsics_vec128_shift_right64(f0, 26U),
        Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
    Lib_IntVector_Intrinsics_vec128
    f20 =
      Lib_IntVector_Intrinsics_vec128_or(Lib_IntVector_Intrinsics_vec128_shift_right64(f0, 52U),
        Lib_IntVector_Intrinsics_vec128_shift_left64(Lib_IntVector_Intrinsics_vec128_and(f1,
            Lib_IntVector_Intrinsics_vec128_load64(0x3fffULL)),
          12U));
    Lib_IntVector_Intrinsics_vec128
    f30 =
      Lib_IntVector_Intrinsics_vec128_and(Lib_IntVector_Intrinsics_vec128_shift_right64(f1, 14U),
        Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
    Lib_IntVector_Intrinsics_vec128 f40 = Lib_IntVector_Intrinsics_vec128_shift_right64(f1, 40U);
    Lib_IntVector_Intrinsics_vec128 f01 = f010;
    Lib_IntVector_Intrinsics_vec128 f111 = f110;
    Lib_IntVector_Intrinsics_vec128 f2 = f20;
    Lib_IntVector_Intrinsics_vec128 f3 = f30;
    Lib_IntVector_Intrinsics_vec128 f4 = f40;
    e[0U] = f01;
    e[1U] = f111;
    e[2U] = f2;
    e[3U] = f3;
    e[4U] = f4;
    uint64_t b = 1ULL << rem1 * 8U % 26U;
    Lib_IntVector_Intrinsics_vec128 mask = Lib_IntVector_Intrinsics_vec128_load64(b);
    Lib_IntVector_Intrinsics_vec128 fi = e[rem1 * 8U / 26U];
    e[rem1 * 8U / 26U] = Lib_IntVector_Intrinsics_vec128_or(fi, mask);
    Lib_IntVector_Intrinsics_vec128 *r1 = pre0;
    Lib_IntVector_Intrinsics_vec128 *r5 = pre0 + 5U;
    Lib_IntVector_Intrinsics_vec128 r0 = r1[0U];
    Lib_IntVector_Intrinsics_vec128 r11 = r1[1U];
    Lib_IntVector_Intrinsics_vec128 r2 = r1[2U];
    Lib_IntVector_Intrinsics_vec128 r3 = r1[3U];
    Lib_IntVector_Intrinsics_vec128 r4 = r1[4U];
    Lib_IntVector_Intrinsics_vec128 r51 = r5[1U];
    Lib_IntVector_Intrinsics_vec128 r52 = r5[2U];
    Lib_IntVector_Intrinsics_vec128 r53 = r5[3U];
    Lib_IntVector_Intrinsics_vec128 r54 = r5[4U];
    Lib_IntVector_Intrinsics_vec128 f10 = e[0U];
    Lib_IntVector_Intrinsics_vec128 f11 = e[1U];
    Lib_IntVector_Intrinsics_vec128 f12 = e[2U];
    Lib_IntVector_Intrinsics_vec128 f13 = e[3U];
    Lib_IntVector_Intrinsics_vec128 f14 = e[4U];
    Lib_IntVector_Intrinsics_vec128 a0 = acc0[0U];
    Lib_IntVector_Intrinsics_vec128 a1 = acc0[1U];
    Lib_IntVector_Intrinsics_vec128 a2 = acc0[2U];
    Lib_IntVector_Intrinsics_vec128 a3 = acc0[3U];
    Lib_IntVector_Intrinsics_vec128 a4 = acc0[4U];
    Lib_IntVector_Intrinsics_vec128 a01 = Lib_IntVector_Intrinsics_vec128_add64(a0, f10);
    Lib_IntVector_Intrinsics_vec128 a11 = Lib_IntVector_Intrinsics_vec128_add64(a1, f11);
    Lib_IntVector_Intrinsics_vec128 a21 = Lib_IntVector_Intrinsics_vec128_add64(a2, f12);
    Lib_IntVector_Intrinsics_vec128 a31 = Lib_IntVector_Intrinsics_vec128_add64(a3, f13);
    Lib_IntVector_Intrinsics_vec128 a41 = Lib_IntVector_Intrinsics_vec128_add64(a4, f14);
    Lib_IntVector_Intrinsics_vec128 a02 = Lib_IntVector_Intrinsics_vec128_mul64(r0, a01);
    Lib_IntVector_Intrinsics_vec128 a12 = Lib_IntVector_Intrinsics_vec128_mul64(r11, a01);
    Lib_IntVector_Intrinsics_vec128 a22 = Lib_IntVector_Intrinsics_vec128_mul64(r2, a01);
    Lib_IntVector_Intrinsics_vec128 a32 = Lib_IntVector_Intrinsics_vec128_mul64(r3, a01);
    Lib_IntVector_Intrinsics_vec128 a42 = Lib_IntVector_Intrinsics_vec128_mul64(r4, a01);
    Lib_IntVector_Intrinsics_vec128
    a03 =
      Lib_IntVector_Intrinsics_vec128_add64(a02,
        Lib_IntVector_Intrinsics_vec128_mul64(r54, a11));
    Lib_IntVector_Intrinsics_vec128
    a13 =
      Lib_IntVector_Intrinsics_vec128_add64(a12,
        Lib_IntVector_Intrinsics_vec128_mul64(r0, a11));
    Lib_IntVector_Intrinsics_vec128
    a23 =
      Lib_IntVector_Intrinsics_vec128_add64(a22,
        Lib_IntVector_Intrinsics_vec128_mul64(r11, a11));
    Lib_IntVector_Intrinsics_vec128
    a33 =
      Lib_IntVector_Intrinsics_vec128_add64(a32,
        Lib_IntVector_Intrinsics_vec128_mul64(r2, a11));
    Lib_IntVector_Intrinsics_vec128
    a43 =
      Lib_IntVector_Intrinsics_vec128_add64(a42,
        Lib_IntVector_Intrinsics_vec128_mul64(r3, a11));
    Lib_IntVector_Intrinsics_vec128
    a04 =
      Lib_IntVector_Intrinsics_vec128_add64(a03,
        Lib_IntVector_Intrinsics_vec128_mul64(r53, a21));
    Lib_IntVector_Intrinsics_vec128
    a14 =
      Lib_IntVector_Intrinsics_vec128_add64(a13,
        Lib_IntVector_Intrinsics_vec128_mul64(r54, a21));
    Lib_IntVector_Intrinsics_vec128
    a24 =
      Lib_IntVector_Intrinsics_vec128_add64(a23,
        Lib_IntVector_Intrinsics_vec128_mul64(r0, a21));
    Lib_IntVector_Intrinsics_vec128
    a34 =
      Lib_IntVector_Intrinsics_vec128_add64(a33,
        Lib_IntVector_Intrinsics_vec128_mul64(r11, a21));
    Lib_IntVector_Intrinsics_vec128
    a44 =
      Lib_IntVector_Intrinsics_vec128_add64(a43,
        Lib_IntVector_Intrinsics_vec128_mul64(r2, a21));
    Lib_IntVector_Intrinsics_vec128
    a05 =
      Lib_IntVector_Intrinsics_vec128_add64(a04,
        Lib_IntVector_Intrinsics_vec128_mul64(r52, a31));
    Lib_IntVector_Intrinsics_vec128
    a15 =
      Lib_IntVector_Intrinsics_vec128_add64(a14,
        Lib_IntVector_Intrinsics_vec128_mul64(r53, a31));
    Lib_IntVector_Intrinsics_vec128
    a25 =
      Lib_IntVector_Intrinsics_vec128_add64(a24,
        Lib_IntVector_Intrinsics_vec128_mul64(r54, a31));
    Lib_IntVector_Intrinsics_vec128
    a35 =
      Lib_IntVector_Intrinsics_vec128_add64(a34,
        Lib_IntVector_Intrinsics_vec128_mul64(r0, a31));
    Lib_IntVector_Intrinsics_vec128
    a45 =
      Lib_IntVector_Intrinsics_vec128_add64(a44,
        Lib_IntVector_Intrinsics_vec128_mul64(r11, a31));
    Lib_IntVector_Intrinsics_vec128
    a06 =
      Lib_IntVector_Intrinsics_vec128_add64(a05,
        Lib_IntVector_Intrinsics_vec128_mul64(r51, a41));
    Lib_IntVector_Intrinsics_vec128
    a16 =
      Lib_IntVector_Intrinsics_vec128_add64(a15,
        Lib_IntVector_Intrinsics_vec128_mul64(r52, a41));
    Lib_IntVector_Intrinsics_vec128
    a26 =
      Lib_IntVector_Intrinsics_vec128_add64(a25,
        Lib_IntVector_Intrinsics_vec128_mul64(r53, a41));
    Lib_IntVector_Intrinsics_vec128
    a36 =
      Lib_IntVector_Intrinsics_vec128_add64(a35,
        Lib_IntVector_Intrinsics_vec128_mul64(r54, a41));
    Lib_IntVector_Intrinsics_vec128
    a46 =
      Lib_IntVector_Intrinsics_vec128_add64(a45,
        Lib_IntVector_Intrinsics_vec128_mul64(r0, a41));
    Lib_IntVector_Intrinsics_vec128 t01 = a06;
    Lib_IntVector_Intrinsics_vec128 t11 = a16;
    Lib_IntVector_Intrinsics_vec128 t2 = a26;
    Lib_IntVector_Intrinsics_vec128 t3 = a36;
    Lib_IntVector_Intrinsics_vec128 t4 = a46;
    Lib_IntVector_Intrinsics_vec128 mask26 = Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL);
    Lib_IntVector_Intrinsics_vec128 z0 = Lib_IntVector_Intrinsics_vec128_shift_right64(t01, 26U);
    Lib_IntVector_Intrinsics_vec128 z1 = Lib_IntVector_Intrinsics_vec128_shift_right64(t3, 26U);
    Lib_IntVector_Intrinsics_vec128 x0 = Lib_IntVector_Intrinsics_vec128_and(t01, mask26);
    Lib_IntVector_Intrinsics_vec128 x3 = Lib_IntVector_Intrinsics_vec128_and(t3, mask26);
    Lib_IntVector_Intrinsics_vec128 x1 = Lib_IntVector_Intrinsics_vec128_add64(t11, z0);
    Lib_IntVector_Intrinsics_vec128 x4 = Lib_IntVector_Intrinsics_vec128_add64(t4, z1);
    Lib_IntVector_Intrinsics_vec128 z01 = Lib_IntVector_Intrinsics_vec128_shift_right64(x1, 26U);
    Lib_IntVector_Intrinsics_vec128 z11 = Lib_IntVector_Intrinsics_vec128_shift_right64(x4, 26U);
    Lib_IntVector_Intrinsics_vec128 t = Lib_IntVector_Intrinsics_vec128_shift_left64(z11, 2U);
    Lib_IntVector_Intrinsics_vec128 z12 = Lib_IntVector_Intrinsics_vec128_add64(z11, t);
    Lib_IntVector_Intrinsics_vec128 x11 = Lib_IntVector_Intrinsics_vec128_and(x1, mask26);
    Lib_IntVector_Intrinsics_vec128 x41 = Lib_IntVector_Intrinsics_vec128_and(x4, mask26);
    Lib_IntVector_Intrinsics_vec128 x2 = Lib_IntVector_Intrinsics_vec128_add64(t2, z01);
    Lib_IntVector_Intrinsics_vec128 x01 = Lib_IntVector_Intrinsics_vec128_add64(x0, z12);
    Lib_IntVector_Intrinsics_vec128 z02 = Lib_IntVector_Intrinsics_vec128_shift_right64(x2, 26U);
    Lib_IntVector_Intrinsics_vec128 z13 = Lib_IntVector_Intrinsics_vec128_shift_right64(x01, 26U);
    Lib_IntVector_Intrinsics_vec128 x21 = Lib_IntVector_Intrinsics_vec128_and(x2, mask26);
    Lib_IntVector_Intrinsics_vec128 x02 = Lib_IntVector_Intrinsics_vec128_and(x01, mask26);
    Lib_IntVector_Intrinsics_vec128 x31 = Lib_IntVector_Intrinsics_vec128_add64(x3, z02);
    Lib_IntVector_Intrinsics_vec128 x12 = Lib_IntVector_Intrinsics_vec128_add64(x11, z13);
    Lib_IntVector_Intrinsics_vec128 z03 = Lib_IntVector_Intrinsics_vec128_shift_right64(x31, 26U);
    Lib_IntVector_Intrinsics_vec128 x32 = Lib_IntVector_Intrinsics_vec128_and(x31, mask26);
    Lib_IntVector_Intrinsics_vec128 x42 = Lib_IntVector_Intrinsics_vec128_add64(x41, z03);
    Lib_IntVector_Intrinsics_vec128 o0 = x02;
    Lib_IntVector_Intrinsics_vec128 o1 = x12;
    Lib_IntVector_Intrinsics_vec128 o2 = x21;
    Lib_IntVector_Intrinsics_vec128 o3 = x32;
    Lib_IntVector_Intrinsics_vec128 o4 = x42;
    acc0[0U] = o0;
    acc0[1U] = o1;
    acc0[2U] = o2;
    acc0[3U] = o3;
    acc0[4U] = o4;
  }
  uint8_t tmp[16U] = { 0U };
  memcpy(tmp, rem, r * sizeof (uint8_t));
  if (r > 0U)
  {
    Lib_IntVector_Intrinsics_vec128 *pre = ctx + 5U;
    Lib_IntVector_Intrinsics_vec128 *acc = ctx;
    KRML_PRE_ALIGN(16) Lib_IntVector_Intrinsics_vec128 e[5U] KRML_POST_ALIGN(16) = { 0U };
    uint64_t u0 = load64_le(tmp);
    uint64_t lo = u0;
    uint64_t u = load64_le(tmp + 8U);
    uint64_t hi = u;
    Lib_IntVector_Intrinsics_vec128 f0 = Lib_IntVector_Intrinsics_vec128_load64(lo);
    Lib_IntVector_Intrinsics_vec128 f1 = Lib_IntVector_Intrinsics_vec128_load64(hi);
    Lib_IntVector_Intrinsics_vec128
    f010 =
      Lib_IntVector_Intrinsics_vec128_and(f0,
        Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
    Lib_IntVector_Intrinsics_vec128
    f110 =
      Lib_IntVector_Intrinsics_vec128_and(Lib_IntVector_Intrinsics_vec128_shift_right64(f0, 26U),
        Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
    Lib_IntVector_Intrinsics_vec128
    f20 =
      Lib_IntVector_Intrinsics_vec128_or(Lib_IntVector_Intrinsics_vec128_shift_right64(f0, 52U),
        Lib_IntVector_Intrinsics_vec128_shift_left64(Lib_IntVector_Intrinsics_vec128_and(f1,
            Lib_IntVector_Intrinsics_vec128_load64(0x3fffULL)),
          12U));
    Lib_IntVector_Intrinsics_vec128
    f30 =
      Lib_IntVector_Intrinsics_vec128_and(Lib_IntVector_Intrinsics_vec128_shift_right64(f1, 14U),
        Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL));
    Lib_IntVector_Intrinsics_vec128 f40 = Lib_IntVector_Intrinsics_vec128_shift_right64(f1, 40U);
    Lib_IntVector_Intrinsics_vec128 f01 = f010;
    Lib_IntVector_Intrinsics_vec128 f111 = f110;
    Lib_IntVector_Intrinsics_vec128 f2 = f20;
    Lib_IntVector_Intrinsics_vec128 f3 = f30;
    Lib_IntVector_Intrinsics_vec128 f41 = f40;
    e[0U] = f01;
    e[1U] = f111;
    e[2U] = f2;
    e[3U] = f3;
    e[4U] = f41;
    uint64_t b = 0x1000000ULL;
    Lib_IntVector_Intrinsics_vec128 mask = Lib_IntVector_Intrinsics_vec128_load64(b);
    Lib_IntVector_Intrinsics_vec128 f4 = e[4U];
    e[4U] = Lib_IntVector_Intrinsics_vec128_or(f4, mask);
    Lib_IntVector_Intrinsics_vec128 *r1 = pre;
    Lib_IntVector_Intrinsics_vec128 *r5 = pre + 5U;
    Lib_IntVector_Intrinsics_vec128 r0 = r1[0U];
    Lib_IntVector_Intrinsics_vec128 r11 = r1[1U];
    Lib_IntVector_Intrinsics_vec128 r2 = r1[2U];
    Lib_IntVector_Intrinsics_vec128 r3 = r1[3U];
    Lib_IntVector_Intrinsics_vec128 r4 = r1[4U];
    Lib_IntVector_Intrinsics_vec128 r51 = r5[1U];
    Lib_IntVector_Intrinsics_vec128 r52 = r5[2U];
    Lib_IntVector_Intrinsics_vec128 r53 = r5[3U];
    Lib_IntVector_Intrinsics_vec128 r54 = r5[4U];
    Lib_IntVector_Intrinsics_vec128 f10 = e[0U];
    Lib_IntVector_Intrinsics_vec128 f11 = e[1U];
    Lib_IntVector_Intrinsics_vec128 f12 = e[2U];
    Lib_IntVector_Intrinsics_vec128 f13 = e[3U];
    Lib_IntVector_Intrinsics_vec128 f14 = e[4U];
    Lib_IntVector_Intrinsics_vec128 a0 = acc[0U];
    Lib_IntVector_Intrinsics_vec128 a1 = acc[1U];
    Lib_IntVector_Intrinsics_vec128 a2 = acc[2U];
    Lib_IntVector_Intrinsics_vec128 a3 = acc[3U];
    Lib_IntVector_Intrinsics_vec128 a4 = acc[4U];
    Lib_IntVector_Intrinsics_vec128 a01 = Lib_IntVector_Intrinsics_vec128_add64(a0, f10);
    Lib_IntVector_Intrinsics_vec128 a11 = Lib_IntVector_Intrinsics_vec128_add64(a1, f11);
    Lib_IntVector_Intrinsics_vec128 a21 = Lib_IntVector_Intrinsics_vec128_add64(a2, f12);
    Lib_IntVector_Intrinsics_vec128 a31 = Lib_IntVector_Intrinsics_vec128_add64(a3, f13);
    Lib_IntVector_Intrinsics_vec128 a41 = Lib_IntVector_Intrinsics_vec128_add64(a4, f14);
    Lib_IntVector_Intrinsics_vec128 a02 = Lib_IntVector_Intrinsics_vec128_mul64(r0, a01);
    Lib_IntVector_Intrinsics_vec128 a12 = Lib_IntVector_Intrinsics_vec128_mul64(r11, a01);
    Lib_IntVector_Intrinsics_vec128 a22 = Lib_IntVector_Intrinsics_vec128_mul64(r2, a01);
    Lib_IntVector_Intrinsics_vec128 a32 = Lib_IntVector_Intrinsics_vec128_mul64(r3, a01);
    Lib_IntVector_Intrinsics_vec128 a42 = Lib_IntVector_Intrinsics_vec128_mul64(r4, a01);
    Lib_IntVector_Intrinsics_vec128
    a03 =
      Lib_IntVector_Intrinsics_vec128_add64(a02,
        Lib_IntVector_Intrinsics_vec128_mul64(r54, a11));
    Lib_IntVector_Intrinsics_vec128
    a13 =
      Lib_IntVector_Intrinsics_vec128_add64(a12,
        Lib_IntVector_Intrinsics_vec128_mul64(r0, a11));
    Lib_IntVector_Intrinsics_vec128
    a23 =
      Lib_IntVector_Intrinsics_vec128_add64(a22,
        Lib_IntVector_Intrinsics_vec128_mul64(r11, a11));
    Lib_IntVector_Intrinsics_vec128
    a33 =
      Lib_IntVector_Intrinsics_vec128_add64(a32,
        Lib_IntVector_Intrinsics_vec128_mul64(r2, a11));
    Lib_IntVector_Intrinsics_vec128
    a43 =
      Lib_IntVector_Intrinsics_vec128_add64(a42,
        Lib_IntVector_Intrinsics_vec128_mul64(r3, a11));
    Lib_IntVector_Intrinsics_vec128
    a04 =
      Lib_IntVector_Intrinsics_vec128_add64(a03,
        Lib_IntVector_Intrinsics_vec128_mul64(r53, a21));
    Lib_IntVector_Intrinsics_vec128
    a14 =
      Lib_IntVector_Intrinsics_vec128_add64(a13,
        Lib_IntVector_Intrinsics_vec128_mul64(r54, a21));
    Lib_IntVector_Intrinsics_vec128
    a24 =
      Lib_IntVector_Intrinsics_vec128_add64(a23,
        Lib_IntVector_Intrinsics_vec128_mul64(r0, a21));
    Lib_IntVector_Intrinsics_vec128
    a34 =
      Lib_IntVector_Intrinsics_vec128_add64(a33,
        Lib_IntVector_Intrinsics_vec128_mul64(r11, a21));
    Lib_IntVector_Intrinsics_vec128
    a44 =
      Lib_IntVector_Intrinsics_vec128_add64(a43,
        Lib_IntVector_Intrinsics_vec128_mul64(r2, a21));
    Lib_IntVector_Intrinsics_vec128
    a05 =
      Lib_IntVector_Intrinsics_vec128_add64(a04,
        Lib_IntVector_Intrinsics_vec128_mul64(r52, a31));
    Lib_IntVector_Intrinsics_vec128
    a15 =
      Lib_IntVector_Intrinsics_vec128_add64(a14,
        Lib_IntVector_Intrinsics_vec128_mul64(r53, a31));
    Lib_IntVector_Intrinsics_vec128
    a25 =
      Lib_IntVector_Intrinsics_vec128_add64(a24,
        Lib_IntVector_Intrinsics_vec128_mul64(r54, a31));
    Lib_IntVector_Intrinsics_vec128
    a35 =
      Lib_IntVector_Intrinsics_vec128_add64(a34,
        Lib_IntVector_Intrinsics_vec128_mul64(r0, a31));
    Lib_IntVector_Intrinsics_vec128
    a45 =
      Lib_IntVector_Intrinsics_vec128_add64(a44,
        Lib_IntVector_Intrinsics_vec128_mul64(r11, a31));
    Lib_IntVector_Intrinsics_vec128
    a06 =
      Lib_IntVector_Intrinsics_vec128_add64(a05,
        Lib_IntVector_Intrinsics_vec128_mul64(r51, a41));
    Lib_IntVector_Intrinsics_vec128
    a16 =
      Lib_IntVector_Intrinsics_vec128_add64(a15,
        Lib_IntVector_Intrinsics_vec128_mul64(r52, a41));
    Lib_IntVector_Intrinsics_vec128
    a26 =
      Lib_IntVector_Intrinsics_vec128_add64(a25,
        Lib_IntVector_Intrinsics_vec128_mul64(r53, a41));
    Lib_IntVector_Intrinsics_vec128
    a36 =
      Lib_IntVector_Intrinsics_vec128_add64(a35,
        Lib_IntVector_Intrinsics_vec128_mul64(r54, a41));
    Lib_IntVector_Intrinsics_vec128
    a46 =
      Lib_IntVector_Intrinsics_vec128_add64(a45,
        Lib_IntVector_Intrinsics_vec128_mul64(r0, a41));
    Lib_IntVector_Intrinsics_vec128 t0 = a06;
    Lib_IntVector_Intrinsics_vec128 t1 = a16;
    Lib_IntVector_Intrinsics_vec128 t2 = a26;
    Lib_IntVector_Intrinsics_vec128 t3 = a36;
    Lib_IntVector_Intrinsics_vec128 t4 = a46;
    Lib_IntVector_Intrinsics_vec128 mask26 = Lib_IntVector_Intrinsics_vec128_load64(0x3ffffffULL);
    Lib_IntVector_Intrinsics_vec128 z0 = Lib_IntVector_Intrinsics_vec128_shift_right64(t0, 26U);
    Lib_IntVector_Intrinsics_vec128 z1 = Lib_IntVector_Intrinsics_vec128_shift_right64(t3, 26U);
    Lib_IntVector_Intrinsics_vec128 x0 = Lib_IntVector_Intrinsics_vec128_and(t0, mask26);
    Lib_IntVector_Intrinsics_vec128 x3 = Lib_IntVector_Intrinsics_vec128_and(t3, mask26);
    Lib_IntVector_Intrinsics_vec128 x1 = Lib_IntVector_Intrinsics_vec128_add64(t1, z0);
    Lib_IntVector_Intrinsics_vec128 x4 = Lib_IntVector_Intrinsics_vec128_add64(t4, z1);
    Lib_IntVector_Intrinsics_vec128 z01 = Lib_IntVector_Intrinsics_vec128_shift_right64(x1, 26U);
    Lib_IntVector_Intrinsics_vec128 z11 = Lib_IntVector_Intrinsics_vec128_shift_right64(x4, 26U);
    Lib_IntVector_Intrinsics_vec128 t = Lib_IntVector_Intrinsics_vec128_shift_left64(z11, 2U);
    Lib_IntVector_Intrinsics_vec128 z12 = Lib_IntVector_Intrinsics_vec128_add64(z11, t);
    Lib_IntVector_Intrinsics_vec128 x11 = Lib_IntVector_Intrinsics_vec128_and(x1, mask26);
    Lib_IntVector_Intrinsics_vec128 x41 = Lib_IntVector_Intrinsics_vec128_and(x4, mask26);
    Lib_IntVector_Intrinsics_vec128 x2 = Lib_IntVector_Intrinsics_vec128_add64(t2, z01);
    Lib_IntVector_Intrinsics_vec128 x01 = Lib_IntVector_Intrinsics_vec128_add64(x0, z12);
    Lib_IntVector_Intrinsics_vec128 z02 = Lib_IntVector_Intrinsics_vec128_shift_right64(x2, 26U);
    Lib_IntVector_Intrinsics_vec128 z13 = Lib_IntVector_Intrinsics_vec128_shift_right64(x01, 26U);
    Lib_IntVector_Intrinsics_vec128 x21 = Lib_IntVector_Intrinsics_vec128_and(x2, mask26);
    Lib_IntVector_Intrinsics_vec128 x02 = Lib_IntVector_Intrinsics_vec128_and(x01, mask26);
    Lib_IntVector_Intrinsics_vec128 x31 = Lib_IntVector_Intrinsics_vec128_add64(x3, z02);
    Lib_IntVector_Intrinsics_vec128 x12 = Lib_IntVector_Intrinsics_vec128_add64(x11, z13);
    Lib_IntVector_Intrinsics_vec128 z03 = Lib_IntVector_Intrinsics_vec128_shift_right64(x31, 26U);
    Lib_IntVector_Intrinsics_vec128 x32 = Lib_IntVector_Intrinsics_vec128_and(x31, mask26);
    Lib_IntVector_Intrinsics_vec128 x42 = Lib_IntVector_Intrinsics_vec128_add64(x41, z03);
    Lib_IntVector_Intrinsics_vec128 o0 = x02;
    Lib_IntVector_Intrinsics_vec128 o1 = x12;
    Lib_IntVector_Intrinsics_vec128 o2 = x21;
    Lib_IntVector_Intrinsics_vec128 o3 = x32;
    Lib_IntVector_Intrinsics_vec128 o4 = x42;
    acc[0U] = o0;
    acc[1U] = o1;
    acc[2U] = o2;
    acc[3U] = o3;
    acc[4U] = o4;
    return;
  }
}